

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [28];
  undefined1 auVar76 [28];
  undefined4 uVar77;
  ulong uVar78;
  RTCIntersectArguments *pRVar79;
  ulong uVar80;
  ulong uVar81;
  RTCFilterFunctionN p_Var82;
  uint uVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  Geometry *geometry;
  long lVar87;
  undefined8 uVar88;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar89 [16];
  float fVar104;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar101;
  float fVar103;
  float fVar105;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar93 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 bi_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar132 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  vint4 ai_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  vint4 ai;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  float fVar170;
  float fVar179;
  float fVar180;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar186 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar185 [16];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar192;
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  int local_7c4;
  long local_7c0;
  Precalculations *local_7b8;
  Primitive *local_7b0;
  undefined4 local_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  ulong local_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined4 local_508;
  float local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  uint local_4f4;
  uint local_4f0;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  ulong local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar178 [64];
  undefined1 auVar200 [16];
  
  PVar10 = prim[1];
  uVar78 = (ulong)(byte)PVar10;
  auVar146 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar125 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar89._0_4_ = fVar125 * auVar146._0_4_;
  auVar89._4_4_ = fVar125 * auVar146._4_4_;
  auVar89._8_4_ = fVar125 * auVar146._8_4_;
  auVar89._12_4_ = fVar125 * auVar146._12_4_;
  auVar151._0_4_ = fVar125 * (ray->dir).field_0.m128[0];
  auVar151._4_4_ = fVar125 * (ray->dir).field_0.m128[1];
  auVar151._8_4_ = fVar125 * (ray->dir).field_0.m128[2];
  auVar151._12_4_ = fVar125 * (ray->dir).field_0.m128[3];
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xd + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar196 = ZEXT1664(auVar18);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x12 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x13 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x14 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar198 = ZEXT1664(auVar126);
  auVar199._4_4_ = auVar151._0_4_;
  auVar199._0_4_ = auVar151._0_4_;
  auVar199._8_4_ = auVar151._0_4_;
  auVar199._12_4_ = auVar151._0_4_;
  auVar110 = vshufps_avx(auVar151,auVar151,0x55);
  auVar90 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar125 = auVar90._0_4_;
  auVar185._0_4_ = fVar125 * auVar15._0_4_;
  fVar124 = auVar90._4_4_;
  auVar185._4_4_ = fVar124 * auVar15._4_4_;
  fVar102 = auVar90._8_4_;
  auVar185._8_4_ = fVar102 * auVar15._8_4_;
  fVar104 = auVar90._12_4_;
  auVar185._12_4_ = fVar104 * auVar15._12_4_;
  auVar171._0_4_ = auVar18._0_4_ * fVar125;
  auVar171._4_4_ = auVar18._4_4_ * fVar124;
  auVar171._8_4_ = auVar18._8_4_ * fVar102;
  auVar171._12_4_ = auVar18._12_4_ * fVar104;
  auVar164._0_4_ = auVar126._0_4_ * fVar125;
  auVar164._4_4_ = auVar126._4_4_ * fVar124;
  auVar164._8_4_ = auVar126._8_4_ * fVar102;
  auVar164._12_4_ = auVar126._12_4_ * fVar104;
  auVar90 = vfmadd231ps_fma(auVar185,auVar110,auVar14);
  auVar111 = vfmadd231ps_fma(auVar171,auVar110,auVar17);
  auVar110 = vfmadd231ps_fma(auVar164,auVar91,auVar110);
  auVar138 = vfmadd231ps_fma(auVar90,auVar199,auVar146);
  auVar187 = ZEXT1664(auVar138);
  auVar111 = vfmadd231ps_fma(auVar111,auVar199,auVar16);
  auVar143 = vfmadd231ps_fma(auVar110,auVar92,auVar199);
  auVar200._4_4_ = auVar89._0_4_;
  auVar200._0_4_ = auVar89._0_4_;
  auVar200._8_4_ = auVar89._0_4_;
  auVar200._12_4_ = auVar89._0_4_;
  auVar203 = ZEXT1664(auVar200);
  auVar110 = vshufps_avx(auVar89,auVar89,0x55);
  auVar90 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar125 = auVar90._0_4_;
  auVar152._0_4_ = fVar125 * auVar15._0_4_;
  fVar124 = auVar90._4_4_;
  auVar152._4_4_ = fVar124 * auVar15._4_4_;
  fVar102 = auVar90._8_4_;
  auVar152._8_4_ = fVar102 * auVar15._8_4_;
  fVar104 = auVar90._12_4_;
  auVar152._12_4_ = fVar104 * auVar15._12_4_;
  auVar109._0_4_ = auVar18._0_4_ * fVar125;
  auVar109._4_4_ = auVar18._4_4_ * fVar124;
  auVar109._8_4_ = auVar18._8_4_ * fVar102;
  auVar109._12_4_ = auVar18._12_4_ * fVar104;
  auVar90._0_4_ = auVar126._0_4_ * fVar125;
  auVar90._4_4_ = auVar126._4_4_ * fVar124;
  auVar90._8_4_ = auVar126._8_4_ * fVar102;
  auVar90._12_4_ = auVar126._12_4_ * fVar104;
  auVar14 = vfmadd231ps_fma(auVar152,auVar110,auVar14);
  auVar15 = vfmadd231ps_fma(auVar109,auVar110,auVar17);
  auVar17 = vfmadd231ps_fma(auVar90,auVar110,auVar91);
  auVar18 = vfmadd231ps_fma(auVar14,auVar200,auVar146);
  auVar91 = vfmadd231ps_fma(auVar15,auVar200,auVar16);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar126 = vfmadd231ps_fma(auVar17,auVar200,auVar92);
  auVar146 = vandps_avx(auVar138,local_290);
  auVar142._8_4_ = 0x219392ef;
  auVar142._0_8_ = 0x219392ef219392ef;
  auVar142._12_4_ = 0x219392ef;
  auVar146 = vcmpps_avx(auVar146,auVar142,1);
  auVar14 = vblendvps_avx(auVar138,auVar142,auVar146);
  auVar146 = vandps_avx(auVar111,local_290);
  auVar146 = vcmpps_avx(auVar146,auVar142,1);
  auVar15 = vblendvps_avx(auVar111,auVar142,auVar146);
  auVar146 = vandps_avx(local_290,auVar143);
  auVar146 = vcmpps_avx(auVar146,auVar142,1);
  auVar146 = vblendvps_avx(auVar143,auVar142,auVar146);
  auVar16 = vrcpps_avx(auVar14);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = 0x3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar16,auVar165);
  auVar16 = vfmadd132ps_fma(auVar14,auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar14,auVar165);
  auVar17 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar146);
  auVar146 = vfnmadd213ps_fma(auVar146,auVar14,auVar165);
  auVar92 = vfmadd132ps_fma(auVar146,auVar14,auVar14);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar15 = vsubps_avx(auVar146,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar146 = vpmovsxwd_avx(auVar14);
  auVar143._0_4_ = auVar16._0_4_ * auVar15._0_4_;
  auVar143._4_4_ = auVar16._4_4_ * auVar15._4_4_;
  auVar143._8_4_ = auVar16._8_4_ * auVar15._8_4_;
  auVar143._12_4_ = auVar16._12_4_ * auVar15._12_4_;
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar18);
  auVar153._0_4_ = auVar16._0_4_ * auVar146._0_4_;
  auVar153._4_4_ = auVar16._4_4_ * auVar146._4_4_;
  auVar153._8_4_ = auVar16._8_4_ * auVar146._8_4_;
  auVar153._12_4_ = auVar16._12_4_ * auVar146._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar78 * 0xe + 6);
  auVar146 = vpmovsxwd_avx(auVar15);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar14 = vsubps_avx(auVar146,auVar91);
  auVar111._1_3_ = 0;
  auVar111[0] = PVar10;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar146 = vpmovsxwd_avx(auVar16);
  auVar159._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar159._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar159._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar159._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar91);
  auVar110._0_4_ = auVar17._0_4_ * auVar146._0_4_;
  auVar110._4_4_ = auVar17._4_4_ * auVar146._4_4_;
  auVar110._8_4_ = auVar17._8_4_ * auVar146._8_4_;
  auVar110._12_4_ = auVar17._12_4_ * auVar146._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar78 * 0x15 + 6);
  auVar146 = vpmovsxwd_avx(auVar17);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar126);
  auVar138._0_4_ = auVar92._0_4_ * auVar146._0_4_;
  auVar138._4_4_ = auVar92._4_4_ * auVar146._4_4_;
  auVar138._8_4_ = auVar92._8_4_ * auVar146._8_4_;
  auVar138._12_4_ = auVar92._12_4_ * auVar146._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar146 = vpmovsxwd_avx(auVar18);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar126);
  auVar91._0_4_ = auVar92._0_4_ * auVar146._0_4_;
  auVar91._4_4_ = auVar92._4_4_ * auVar146._4_4_;
  auVar91._8_4_ = auVar92._8_4_ * auVar146._8_4_;
  auVar91._12_4_ = auVar92._12_4_ * auVar146._12_4_;
  auVar146 = vpminsd_avx(auVar143,auVar153);
  auVar14 = vpminsd_avx(auVar159,auVar110);
  auVar146 = vmaxps_avx(auVar146,auVar14);
  auVar14 = vpminsd_avx(auVar138,auVar91);
  uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar172._4_4_ = uVar77;
  auVar172._0_4_ = uVar77;
  auVar172._8_4_ = uVar77;
  auVar172._12_4_ = uVar77;
  auVar178 = ZEXT1664(auVar172);
  auVar14 = vmaxps_avx(auVar14,auVar172);
  auVar146 = vmaxps_avx(auVar146,auVar14);
  local_2a0._0_4_ = auVar146._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar146._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar146._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar146._12_4_ * 0.99999964;
  auVar146 = vpmaxsd_avx(auVar143,auVar153);
  auVar14 = vpmaxsd_avx(auVar159,auVar110);
  auVar146 = vminps_avx(auVar146,auVar14);
  auVar14 = vpmaxsd_avx(auVar138,auVar91);
  fVar125 = ray->tfar;
  auVar126._4_4_ = fVar125;
  auVar126._0_4_ = fVar125;
  auVar126._8_4_ = fVar125;
  auVar126._12_4_ = fVar125;
  auVar14 = vminps_avx(auVar14,auVar126);
  auVar146 = vminps_avx(auVar146,auVar14);
  auVar92._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar92._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar92._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar92._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar111[4] = PVar10;
  auVar111._5_3_ = 0;
  auVar111[8] = PVar10;
  auVar111._9_3_ = 0;
  auVar111[0xc] = PVar10;
  auVar111._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar111,_DAT_01f4ad30);
  auVar146 = vcmpps_avx(local_2a0,auVar92,2);
  auVar146 = vandps_avx(auVar146,auVar14);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  uVar83 = vmovmskps_avx(auVar146);
  local_7b8 = pre;
  local_7b0 = prim;
  for (; auVar121 = local_3e0, local_4a8 = (ulong)uVar83, local_4a8 != 0;
      uVar83 = (uint)uVar86 & uVar83) {
    auVar120 = auVar198._0_32_;
    auVar186 = auVar187._0_32_;
    local_6a0 = auVar178._0_32_;
    local_640 = auVar196._0_32_;
    lVar85 = 0;
    for (uVar81 = local_4a8; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      lVar85 = lVar85 + 1;
    }
    uVar86 = local_4a8 - 1 & local_4a8;
    local_7a4 = *(undefined4 *)(local_7b0 + lVar85 * 4 + 6);
    uVar81 = (ulong)(uint)((int)lVar85 << 6);
    local_6e8 = (ulong)*(uint *)(local_7b0 + 2);
    pGVar12 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
    pPVar1 = prim + uVar81 + uVar78 * 0x19 + 0x16;
    local_600 = *(undefined8 *)pPVar1;
    uStack_5f8 = *(undefined8 *)(pPVar1 + 8);
    if (uVar86 != 0) {
      uVar84 = uVar86 - 1 & uVar86;
      for (uVar80 = uVar86; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar84 != 0) {
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_520 = *(undefined1 (*) [16])(prim + uVar81 + uVar78 * 0x19 + 0x26);
    auVar90 = local_520;
    local_530 = *(undefined1 (*) [16])(prim + uVar81 + uVar78 * 0x19 + 0x36);
    _local_4c0 = *(undefined1 (*) [16])(prim + uVar81 + uVar78 * 0x19 + 0x46);
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (ray->org).field_0;
    auVar14 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar5);
    uVar77 = auVar14._0_4_;
    auVar139._4_4_ = uVar77;
    auVar139._0_4_ = uVar77;
    auVar139._8_4_ = uVar77;
    auVar139._12_4_ = uVar77;
    auVar146 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    aVar6 = (local_7b8->ray_space).vx.field_0;
    aVar7 = (local_7b8->ray_space).vy.field_0;
    fVar125 = (local_7b8->ray_space).vz.field_0.m128[0];
    fVar124 = (local_7b8->ray_space).vz.field_0.m128[1];
    fVar102 = (local_7b8->ray_space).vz.field_0.m128[2];
    fVar104 = (local_7b8->ray_space).vz.field_0.m128[3];
    auVar154._0_4_ = auVar14._0_4_ * fVar125;
    auVar154._4_4_ = auVar14._4_4_ * fVar124;
    auVar154._8_4_ = auVar14._8_4_ * fVar102;
    auVar154._12_4_ = auVar14._12_4_ * fVar104;
    auVar146 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar7,auVar146);
    auVar18 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar6,auVar139);
    auVar146 = vblendps_avx(auVar18,*(undefined1 (*) [16])pPVar1,8);
    auVar15 = vsubps_avx(local_520,(undefined1  [16])aVar5);
    uVar77 = auVar15._0_4_;
    auVar155._4_4_ = uVar77;
    auVar155._0_4_ = uVar77;
    auVar155._8_4_ = uVar77;
    auVar155._12_4_ = uVar77;
    auVar14 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar189._0_4_ = auVar15._0_4_ * fVar125;
    auVar189._4_4_ = auVar15._4_4_ * fVar124;
    auVar189._8_4_ = auVar15._8_4_ * fVar102;
    auVar189._12_4_ = auVar15._12_4_ * fVar104;
    auVar14 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar7,auVar14);
    auVar92 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar6,auVar155);
    auVar14 = vblendps_avx(auVar92,local_520,8);
    auVar110 = local_530;
    auVar16 = vsubps_avx(local_530,(undefined1  [16])aVar5);
    uVar77 = auVar16._0_4_;
    auVar160._4_4_ = uVar77;
    auVar160._0_4_ = uVar77;
    auVar160._8_4_ = uVar77;
    auVar160._12_4_ = uVar77;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar193._0_4_ = auVar16._0_4_ * fVar125;
    auVar193._4_4_ = auVar16._4_4_ * fVar124;
    auVar193._8_4_ = auVar16._8_4_ * fVar102;
    auVar193._12_4_ = auVar16._12_4_ * fVar104;
    auVar15 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar7,auVar15);
    auVar91 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar160);
    auVar15 = vblendps_avx(auVar91,local_530,8);
    auVar17 = vsubps_avx(_local_4c0,(undefined1  [16])aVar5);
    uVar77 = auVar17._0_4_;
    auVar166._4_4_ = uVar77;
    auVar166._0_4_ = uVar77;
    auVar166._8_4_ = uVar77;
    auVar166._12_4_ = uVar77;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar197._0_4_ = auVar17._0_4_ * fVar125;
    auVar197._4_4_ = auVar17._4_4_ * fVar124;
    auVar197._8_4_ = auVar17._8_4_ * fVar102;
    auVar197._12_4_ = auVar17._12_4_ * fVar104;
    auVar16 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar7,auVar16);
    auVar126 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar166);
    auVar16 = vblendps_avx(auVar126,_local_4c0,8);
    auVar146 = vandps_avx(auVar146,local_290);
    auVar14 = vandps_avx(auVar14,local_290);
    auVar17 = vmaxps_avx(auVar146,auVar14);
    auVar146 = vandps_avx(auVar15,local_290);
    auVar14 = vandps_avx(auVar16,local_290);
    auVar146 = vmaxps_avx(auVar146,auVar14);
    auVar146 = vmaxps_avx(auVar17,auVar146);
    auVar14 = vmovshdup_avx(auVar146);
    auVar14 = vmaxss_avx(auVar14,auVar146);
    auVar146 = vshufpd_avx(auVar146,auVar146,1);
    auVar146 = vmaxss_avx(auVar146,auVar14);
    local_7c0 = (long)iVar11;
    lVar85 = local_7c0 * 0x44;
    auVar14 = vmovshdup_avx(auVar18);
    uVar88 = auVar14._0_8_;
    local_400._8_8_ = uVar88;
    local_400._0_8_ = uVar88;
    local_400._16_8_ = uVar88;
    local_400._24_8_ = uVar88;
    auVar14 = vmovshdup_avx(auVar92);
    uVar88 = auVar14._0_8_;
    local_720._8_8_ = uVar88;
    local_720._0_8_ = uVar88;
    local_720._16_8_ = uVar88;
    local_720._24_8_ = uVar88;
    auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 + 0x908);
    local_680._0_4_ = auVar91._0_4_;
    local_680._4_4_ = local_680._0_4_;
    local_680._8_4_ = local_680._0_4_;
    local_680._12_4_ = local_680._0_4_;
    local_680._16_4_ = local_680._0_4_;
    local_680._20_4_ = local_680._0_4_;
    local_680._24_4_ = local_680._0_4_;
    local_680._28_4_ = local_680._0_4_;
    auVar14 = vmovshdup_avx(auVar91);
    uVar88 = auVar14._0_8_;
    local_5c0._8_8_ = uVar88;
    local_5c0._0_8_ = uVar88;
    local_5c0._16_8_ = uVar88;
    local_5c0._24_8_ = uVar88;
    fVar104 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar85 + 0xd8c);
    fVar205 = *(float *)(bspline_basis0 + lVar85 + 0xd90);
    fVar206 = *(float *)(bspline_basis0 + lVar85 + 0xd94);
    fVar207 = *(float *)(bspline_basis0 + lVar85 + 0xd98);
    fVar208 = *(float *)(bspline_basis0 + lVar85 + 0xd9c);
    fVar101 = *(float *)(bspline_basis0 + lVar85 + 0xda0);
    fVar103 = *(float *)(bspline_basis0 + lVar85 + 0xda4);
    auVar75 = *(undefined1 (*) [28])(bspline_basis0 + lVar85 + 0xd8c);
    auVar14 = vmovshdup_avx(auVar126);
    local_580 = auVar14._0_8_;
    local_5a0 = auVar126._0_4_;
    auVar112._0_4_ = fVar104 * local_5a0;
    auVar112._4_4_ = fVar205 * local_5a0;
    auVar112._8_4_ = fVar206 * local_5a0;
    auVar112._12_4_ = fVar207 * local_5a0;
    auVar112._16_4_ = fVar208 * local_5a0;
    auVar112._20_4_ = fVar101 * local_5a0;
    auVar112._24_4_ = fVar103 * local_5a0;
    auVar112._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar112,auVar134,local_680);
    fVar125 = auVar14._0_4_;
    auVar178._0_4_ = fVar104 * fVar125;
    fVar102 = auVar14._4_4_;
    auVar178._4_4_ = fVar205 * fVar102;
    auVar178._8_4_ = fVar206 * fVar125;
    auVar178._12_4_ = fVar207 * fVar102;
    auVar178._16_4_ = fVar208 * fVar125;
    auVar178._20_4_ = fVar101 * fVar102;
    auVar178._28_36_ = auVar203._28_36_;
    auVar178._24_4_ = fVar103 * fVar125;
    auVar14 = vfmadd231ps_fma(auVar178._0_32_,auVar134,local_5c0);
    auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 + 0x484);
    uVar77 = auVar92._0_4_;
    local_620._4_4_ = uVar77;
    local_620._0_4_ = uVar77;
    local_620._8_4_ = uVar77;
    local_620._12_4_ = uVar77;
    local_620._16_4_ = uVar77;
    local_620._20_4_ = uVar77;
    local_620._24_4_ = uVar77;
    local_620._28_4_ = uVar77;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,local_620);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar112,local_720);
    auVar8 = *(undefined1 (*) [32])(bspline_basis0 + lVar85);
    uVar77 = auVar18._0_4_;
    local_560._4_4_ = uVar77;
    local_560._0_4_ = uVar77;
    local_560._8_4_ = uVar77;
    local_560._12_4_ = uVar77;
    local_560._16_4_ = uVar77;
    local_560._20_4_ = uVar77;
    local_560._24_4_ = uVar77;
    local_560._28_4_ = uVar77;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar8,local_560);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar8,local_400);
    auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 + 0x908);
    pauVar2 = (undefined1 (*) [32])(bspline_basis1 + lVar85 + 0xd8c);
    fVar105 = *(float *)*pauVar2;
    fVar106 = *(float *)(bspline_basis1 + lVar85 + 0xd90);
    fVar107 = *(float *)(bspline_basis1 + lVar85 + 0xd94);
    fVar108 = *(float *)(bspline_basis1 + lVar85 + 0xd98);
    fVar70 = *(float *)(bspline_basis1 + lVar85 + 0xd9c);
    fVar188 = *(float *)(bspline_basis1 + lVar85 + 0xda0);
    fVar192 = *(float *)(bspline_basis1 + lVar85 + 0xda4);
    auVar76 = *(undefined1 (*) [28])*pauVar2;
    fStack_59c = local_5a0;
    fStack_598 = local_5a0;
    fStack_594 = local_5a0;
    fStack_590 = local_5a0;
    fStack_58c = local_5a0;
    fStack_588 = local_5a0;
    fStack_584 = local_5a0;
    auVar9._4_4_ = fVar106 * local_5a0;
    auVar9._0_4_ = fVar105 * local_5a0;
    auVar9._8_4_ = fVar107 * local_5a0;
    auVar9._12_4_ = fVar108 * local_5a0;
    auVar9._16_4_ = fVar70 * local_5a0;
    auVar9._20_4_ = fVar188 * local_5a0;
    auVar9._24_4_ = fVar192 * local_5a0;
    auVar9._28_4_ = local_5a0;
    auVar16 = vfmadd231ps_fma(auVar9,auVar99,local_680);
    uStack_578 = local_580;
    uStack_570 = local_580;
    uStack_568 = local_580;
    auVar13._4_4_ = fVar106 * fVar102;
    auVar13._0_4_ = fVar105 * fVar125;
    auVar13._8_4_ = fVar107 * fVar125;
    auVar13._12_4_ = fVar108 * fVar102;
    auVar13._16_4_ = fVar70 * fVar125;
    auVar13._20_4_ = fVar188 * fVar102;
    auVar13._24_4_ = fVar192 * fVar125;
    auVar13._28_4_ = fVar102;
    auVar17 = vfmadd231ps_fma(auVar13,auVar99,local_5c0);
    auVar9 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 + 0x484);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar9,local_620);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar9,local_720);
    local_760 = *(undefined1 (*) [32])(bspline_basis1 + lVar85);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_760,local_560);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_760,local_400);
    local_300 = ZEXT1632(auVar16);
    auVar113 = ZEXT1632(auVar15);
    auVar174 = vsubps_avx(local_300,auVar113);
    local_320 = ZEXT1632(auVar17);
    local_340 = ZEXT1632(auVar14);
    auVar19 = vsubps_avx(local_320,local_340);
    auVar94._0_4_ = auVar14._0_4_ * auVar174._0_4_;
    auVar94._4_4_ = auVar14._4_4_ * auVar174._4_4_;
    auVar94._8_4_ = auVar14._8_4_ * auVar174._8_4_;
    auVar94._12_4_ = auVar14._12_4_ * auVar174._12_4_;
    auVar94._16_4_ = auVar174._16_4_ * 0.0;
    auVar94._20_4_ = auVar174._20_4_ * 0.0;
    auVar94._24_4_ = auVar174._24_4_ * 0.0;
    auVar94._28_4_ = 0;
    fVar170 = auVar19._0_4_;
    auVar114._0_4_ = fVar170 * auVar15._0_4_;
    fVar179 = auVar19._4_4_;
    auVar114._4_4_ = fVar179 * auVar15._4_4_;
    fVar180 = auVar19._8_4_;
    auVar114._8_4_ = fVar180 * auVar15._8_4_;
    fVar181 = auVar19._12_4_;
    auVar114._12_4_ = fVar181 * auVar15._12_4_;
    fVar182 = auVar19._16_4_;
    auVar114._16_4_ = fVar182 * 0.0;
    fVar183 = auVar19._20_4_;
    auVar114._20_4_ = fVar183 * 0.0;
    fVar184 = auVar19._24_4_;
    auVar114._24_4_ = fVar184 * 0.0;
    auVar114._28_4_ = 0;
    auVar94 = vsubps_avx(auVar94,auVar114);
    auVar14 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar88 = auVar14._0_8_;
    local_80._8_8_ = uVar88;
    local_80._0_8_ = uVar88;
    local_80._16_8_ = uVar88;
    local_80._24_8_ = uVar88;
    auVar15 = vpermilps_avx(local_520,0xff);
    uVar88 = auVar15._0_8_;
    local_a0._8_8_ = uVar88;
    local_a0._0_8_ = uVar88;
    local_a0._16_8_ = uVar88;
    local_a0._24_8_ = uVar88;
    auVar15 = vpermilps_avx(local_530,0xff);
    uVar88 = auVar15._0_8_;
    local_c0._8_8_ = uVar88;
    local_c0._0_8_ = uVar88;
    local_c0._16_8_ = uVar88;
    local_c0._24_8_ = uVar88;
    auVar15 = vpermilps_avx(_local_4c0,0xff);
    local_e0 = auVar15._0_8_;
    fVar124 = auVar15._0_4_;
    auVar161._0_4_ = fVar104 * fVar124;
    fVar104 = auVar15._4_4_;
    auVar161._4_4_ = fVar205 * fVar104;
    auVar161._8_4_ = fVar206 * fVar124;
    auVar161._12_4_ = fVar207 * fVar104;
    auVar161._16_4_ = fVar208 * fVar124;
    auVar161._20_4_ = fVar101 * fVar104;
    auVar161._24_4_ = fVar103 * fVar124;
    auVar161._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar161,local_c0,auVar134);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,local_a0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar8,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    _local_360 = *pauVar2;
    auVar114 = _local_360;
    auVar21._4_4_ = fVar106 * fVar104;
    auVar21._0_4_ = fVar105 * fVar124;
    auVar21._8_4_ = fVar107 * fVar124;
    auVar21._12_4_ = fVar108 * fVar104;
    auVar21._16_4_ = fVar70 * fVar124;
    auVar21._20_4_ = fVar188 * fVar104;
    auVar21._24_4_ = fVar192 * fVar124;
    auVar21._28_4_ = auVar8._28_4_;
    auVar15 = vfmadd231ps_fma(auVar21,auVar99,local_c0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar9,local_a0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),local_760,local_80);
    auVar22._4_4_ = fVar179 * fVar179;
    auVar22._0_4_ = fVar170 * fVar170;
    auVar22._8_4_ = fVar180 * fVar180;
    auVar22._12_4_ = fVar181 * fVar181;
    auVar22._16_4_ = fVar182 * fVar182;
    auVar22._20_4_ = fVar183 * fVar183;
    auVar22._24_4_ = fVar184 * fVar184;
    auVar22._28_4_ = auVar14._4_4_;
    auVar14 = vfmadd231ps_fma(auVar22,auVar174,auVar174);
    auVar13 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar20._4_4_ = auVar14._4_4_ * auVar13._4_4_ * auVar13._4_4_;
    auVar20._0_4_ = auVar14._0_4_ * auVar13._0_4_ * auVar13._0_4_;
    auVar20._8_4_ = auVar14._8_4_ * auVar13._8_4_ * auVar13._8_4_;
    auVar20._12_4_ = auVar14._12_4_ * auVar13._12_4_ * auVar13._12_4_;
    auVar20._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
    auVar20._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
    auVar20._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
    auVar20._28_4_ = auVar13._28_4_;
    auVar24._4_4_ = auVar94._4_4_ * auVar94._4_4_;
    auVar24._0_4_ = auVar94._0_4_ * auVar94._0_4_;
    auVar24._8_4_ = auVar94._8_4_ * auVar94._8_4_;
    auVar24._12_4_ = auVar94._12_4_ * auVar94._12_4_;
    auVar24._16_4_ = auVar94._16_4_ * auVar94._16_4_;
    auVar24._20_4_ = auVar94._20_4_ * auVar94._20_4_;
    auVar24._24_4_ = auVar94._24_4_ * auVar94._24_4_;
    auVar24._28_4_ = auVar94._28_4_;
    auVar13 = vcmpps_avx(auVar24,auVar20,2);
    fVar124 = auVar146._0_4_ * 4.7683716e-07;
    auVar115._0_4_ = (float)iVar11;
    local_3e0._4_12_ = auVar126._4_12_;
    local_3e0._0_4_ = auVar115._0_4_;
    local_3e0._16_16_ = auVar121._16_16_;
    auVar115._4_4_ = auVar115._0_4_;
    auVar115._8_4_ = auVar115._0_4_;
    auVar115._12_4_ = auVar115._0_4_;
    auVar115._16_4_ = auVar115._0_4_;
    auVar115._20_4_ = auVar115._0_4_;
    auVar115._24_4_ = auVar115._0_4_;
    auVar115._28_4_ = auVar115._0_4_;
    auVar121 = vcmpps_avx(_DAT_01f7b060,auVar115,1);
    auVar14 = vpermilps_avx(auVar18,0xaa);
    uVar88 = auVar14._0_8_;
    local_480._8_8_ = uVar88;
    local_480._0_8_ = uVar88;
    local_480._16_8_ = uVar88;
    local_480._24_8_ = uVar88;
    auVar15 = vpermilps_avx(auVar92,0xaa);
    uVar88 = auVar15._0_8_;
    local_2c0._8_8_ = uVar88;
    local_2c0._0_8_ = uVar88;
    local_2c0._16_8_ = uVar88;
    local_2c0._24_8_ = uVar88;
    auVar146 = vpermilps_avx(auVar91,0xaa);
    uVar88 = auVar146._0_8_;
    local_2e0._8_8_ = uVar88;
    local_2e0._0_8_ = uVar88;
    local_2e0._16_8_ = uVar88;
    local_2e0._24_8_ = uVar88;
    auVar146 = vshufps_avx(auVar126,auVar126,0xaa);
    local_4e0 = auVar146._0_8_;
    auVar94 = auVar121 & auVar13;
    local_660._0_16_ = vpermilps_avx((undefined1  [16])aVar5,0xff);
    auVar21 = local_660;
    local_740._0_16_ = ZEXT416((uint)fVar124);
    fVar104 = fVar125;
    fVar205 = fVar102;
    fVar206 = fVar125;
    fVar207 = fVar102;
    fVar208 = fVar125;
    uStack_4d8 = local_4e0;
    uStack_4d0 = local_4e0;
    uStack_4c8 = local_4e0;
    local_660 = auVar21;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar187 = ZEXT3264(auVar186);
      auVar198 = ZEXT3264(auVar120);
LAB_01122d91:
      auVar203 = ZEXT3264(local_680);
      auVar196 = ZEXT3264(local_640);
      auVar178 = ZEXT3264(local_6a0);
      auVar204 = ZEXT3264(local_5c0);
      pRVar79 = (RTCIntersectArguments *)0x0;
      auVar167 = ZEXT3264(CONCAT428(local_5a0,
                                    CONCAT424(local_5a0,
                                              CONCAT420(local_5a0,
                                                        CONCAT416(local_5a0,
                                                                  CONCAT412(local_5a0,
                                                                            CONCAT48(local_5a0,
                                                                                     CONCAT44(
                                                  local_5a0,local_5a0))))))));
      auVar169 = ZEXT3264(local_620);
      auVar141 = ZEXT3264(local_560);
      local_530 = auVar110;
      local_520 = auVar90;
    }
    else {
      local_380 = vandps_avx(auVar121,auVar13);
      local_360._0_4_ = auVar76._0_4_;
      local_360._4_4_ = auVar76._4_4_;
      fStack_358 = auVar76._8_4_;
      fStack_354 = auVar76._12_4_;
      fStack_350 = auVar76._16_4_;
      fStack_34c = auVar76._20_4_;
      fStack_348 = auVar76._24_4_;
      fVar188 = auVar146._0_4_;
      fVar192 = auVar146._4_4_;
      auVar121._4_4_ = fVar192 * (float)local_360._4_4_;
      auVar121._0_4_ = fVar188 * (float)local_360._0_4_;
      auVar121._8_4_ = fVar188 * fStack_358;
      auVar121._12_4_ = fVar192 * fStack_354;
      auVar121._16_4_ = fVar188 * fStack_350;
      auVar121._20_4_ = fVar192 * fStack_34c;
      auVar121._24_4_ = fVar188 * fStack_348;
      auVar121._28_4_ = local_380._28_4_;
      auVar146 = vfmadd213ps_fma(auVar99,local_2e0,auVar121);
      auVar146 = vfmadd213ps_fma(auVar9,local_2c0,ZEXT1632(auVar146));
      auVar146 = vfmadd213ps_fma(local_760,local_480,ZEXT1632(auVar146));
      local_460._0_4_ = auVar75._0_4_;
      local_460._4_4_ = auVar75._4_4_;
      fStack_458 = auVar75._8_4_;
      fStack_454 = auVar75._12_4_;
      fStack_450 = auVar75._16_4_;
      fStack_44c = auVar75._20_4_;
      fStack_448 = auVar75._24_4_;
      auVar95._0_4_ = fVar188 * (float)local_460._0_4_;
      auVar95._4_4_ = fVar192 * (float)local_460._4_4_;
      auVar95._8_4_ = fVar188 * fStack_458;
      auVar95._12_4_ = fVar192 * fStack_454;
      auVar95._16_4_ = fVar188 * fStack_450;
      auVar95._20_4_ = fVar192 * fStack_44c;
      auVar95._24_4_ = fVar188 * fStack_448;
      auVar95._28_4_ = 0;
      auVar18 = vfmadd213ps_fma(auVar134,local_2e0,auVar95);
      auVar18 = vfmadd213ps_fma(auVar112,local_2c0,ZEXT1632(auVar18));
      auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 + 0x1210);
      auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 + 0x1694);
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 + 0x1b18);
      fVar101 = *(float *)(bspline_basis0 + lVar85 + 0x1f9c);
      fVar103 = *(float *)(bspline_basis0 + lVar85 + 0x1fa0);
      fVar105 = *(float *)(bspline_basis0 + lVar85 + 0x1fa4);
      fVar106 = *(float *)(bspline_basis0 + lVar85 + 0x1fa8);
      fVar107 = *(float *)(bspline_basis0 + lVar85 + 0x1fac);
      fVar108 = *(float *)(bspline_basis0 + lVar85 + 0x1fb0);
      fVar70 = *(float *)(bspline_basis0 + lVar85 + 0x1fb4);
      auVar131._0_4_ = local_5a0 * fVar101;
      auVar131._4_4_ = local_5a0 * fVar103;
      auVar131._8_4_ = local_5a0 * fVar105;
      auVar131._12_4_ = local_5a0 * fVar106;
      auVar131._16_4_ = local_5a0 * fVar107;
      auVar131._20_4_ = local_5a0 * fVar108;
      auVar131._24_4_ = local_5a0 * fVar70;
      auVar131._28_4_ = 0;
      _local_460 = auVar174;
      auVar99._4_4_ = fVar102 * fVar103;
      auVar99._0_4_ = fVar125 * fVar101;
      auVar99._8_4_ = fVar125 * fVar105;
      auVar99._12_4_ = fVar102 * fVar106;
      auVar99._16_4_ = fVar125 * fVar107;
      auVar99._20_4_ = fVar102 * fVar108;
      auVar99._24_4_ = fVar125 * fVar70;
      auVar99._28_4_ = auVar174._28_4_;
      auVar25._4_4_ = fVar192 * fVar103;
      auVar25._0_4_ = fVar188 * fVar101;
      auVar25._8_4_ = fVar188 * fVar105;
      auVar25._12_4_ = fVar192 * fVar106;
      auVar25._16_4_ = fVar188 * fVar107;
      auVar25._20_4_ = fVar192 * fVar108;
      auVar25._24_4_ = fVar188 * fVar70;
      auVar25._28_4_ = *(undefined4 *)(bspline_basis0 + lVar85 + 0x1fb8);
      auVar92 = vfmadd231ps_fma(auVar131,auVar112,local_680);
      auVar91 = vfmadd231ps_fma(auVar99,auVar112,local_5c0);
      auVar126 = vfmadd231ps_fma(auVar25,local_2e0,auVar112);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar134,local_620);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar134,local_720);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_2c0,auVar134);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar121,local_560);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar121,local_400);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_480,auVar121);
      fVar101 = *(float *)(bspline_basis1 + lVar85 + 0x1f9c);
      fVar103 = *(float *)(bspline_basis1 + lVar85 + 0x1fa0);
      fVar105 = *(float *)(bspline_basis1 + lVar85 + 0x1fa4);
      fVar106 = *(float *)(bspline_basis1 + lVar85 + 0x1fa8);
      fVar107 = *(float *)(bspline_basis1 + lVar85 + 0x1fac);
      fVar108 = *(float *)(bspline_basis1 + lVar85 + 0x1fb0);
      fVar70 = *(float *)(bspline_basis1 + lVar85 + 0x1fb4);
      auVar134._4_4_ = local_5a0 * fVar103;
      auVar134._0_4_ = local_5a0 * fVar101;
      auVar134._8_4_ = local_5a0 * fVar105;
      auVar134._12_4_ = local_5a0 * fVar106;
      auVar134._16_4_ = local_5a0 * fVar107;
      auVar134._20_4_ = local_5a0 * fVar108;
      auVar134._24_4_ = local_5a0 * fVar70;
      auVar134._28_4_ = auVar112._28_4_;
      auVar26._4_4_ = fVar102 * fVar103;
      auVar26._0_4_ = fVar125 * fVar101;
      auVar26._8_4_ = fVar125 * fVar105;
      auVar26._12_4_ = fVar102 * fVar106;
      auVar26._16_4_ = fVar125 * fVar107;
      auVar26._20_4_ = fVar102 * fVar108;
      auVar26._24_4_ = fVar125 * fVar70;
      auVar26._28_4_ = auVar14._4_4_;
      auVar27._4_4_ = fVar192 * fVar103;
      auVar27._0_4_ = fVar188 * fVar101;
      auVar27._8_4_ = fVar188 * fVar105;
      auVar27._12_4_ = fVar192 * fVar106;
      auVar27._16_4_ = fVar188 * fVar107;
      auVar27._20_4_ = fVar192 * fVar108;
      auVar27._24_4_ = fVar188 * fVar70;
      auVar27._28_4_ = fVar102;
      auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 + 0x1b18);
      auVar14 = vfmadd231ps_fma(auVar134,auVar121,local_680);
      auVar111 = vfmadd231ps_fma(auVar26,auVar121,local_5c0);
      auVar138 = vfmadd231ps_fma(auVar27,local_2e0,auVar121);
      auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 + 0x1694);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_620);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar121,local_720);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),local_2c0,auVar121);
      auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 + 0x1210);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_560);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar121,local_400);
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116._16_4_ = 0x7fffffff;
      auVar116._20_4_ = 0x7fffffff;
      auVar116._24_4_ = 0x7fffffff;
      auVar116._28_4_ = 0x7fffffff;
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),local_480,auVar121);
      auVar121 = vandps_avx(ZEXT1632(auVar92),auVar116);
      auVar134 = vandps_avx(ZEXT1632(auVar91),auVar116);
      auVar134 = vmaxps_avx(auVar121,auVar134);
      auVar121 = vandps_avx(ZEXT1632(auVar126),auVar116);
      auVar121 = vmaxps_avx(auVar134,auVar121);
      auVar173._4_4_ = fVar124;
      auVar173._0_4_ = fVar124;
      auVar173._8_4_ = fVar124;
      auVar173._12_4_ = fVar124;
      auVar173._16_4_ = fVar124;
      auVar173._20_4_ = fVar124;
      auVar173._24_4_ = fVar124;
      auVar173._28_4_ = fVar124;
      auVar121 = vcmpps_avx(auVar121,auVar173,1);
      auVar112 = vblendvps_avx(ZEXT1632(auVar92),auVar174,auVar121);
      auVar99 = vblendvps_avx(ZEXT1632(auVar91),auVar19,auVar121);
      auVar121 = vandps_avx(ZEXT1632(auVar14),auVar116);
      auVar134 = vandps_avx(ZEXT1632(auVar111),auVar116);
      auVar134 = vmaxps_avx(auVar121,auVar134);
      auVar121 = vandps_avx(ZEXT1632(auVar138),auVar116);
      auVar121 = vmaxps_avx(auVar134,auVar121);
      auVar134 = vcmpps_avx(auVar121,auVar173,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar14),auVar174,auVar134);
      auVar134 = vblendvps_avx(ZEXT1632(auVar111),auVar19,auVar134);
      auVar14 = vfmadd213ps_fma(auVar8,local_480,ZEXT1632(auVar18));
      auVar18 = vfmadd213ps_fma(auVar112,auVar112,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar99,auVar99);
      auVar8 = vrsqrtps_avx(ZEXT1632(auVar18));
      fVar124 = auVar8._0_4_;
      fVar101 = auVar8._4_4_;
      fVar103 = auVar8._8_4_;
      fVar105 = auVar8._12_4_;
      fVar106 = auVar8._16_4_;
      fVar107 = auVar8._20_4_;
      fVar108 = auVar8._24_4_;
      auVar174._4_4_ = fVar101 * fVar101 * fVar101 * auVar18._4_4_ * -0.5;
      auVar174._0_4_ = fVar124 * fVar124 * fVar124 * auVar18._0_4_ * -0.5;
      auVar174._8_4_ = fVar103 * fVar103 * fVar103 * auVar18._8_4_ * -0.5;
      auVar174._12_4_ = fVar105 * fVar105 * fVar105 * auVar18._12_4_ * -0.5;
      auVar174._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
      auVar174._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
      auVar174._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar174._28_4_ = 0;
      auVar201._8_4_ = 0x3fc00000;
      auVar201._0_8_ = 0x3fc000003fc00000;
      auVar201._12_4_ = 0x3fc00000;
      auVar201._16_4_ = 0x3fc00000;
      auVar201._20_4_ = 0x3fc00000;
      auVar201._24_4_ = 0x3fc00000;
      auVar201._28_4_ = 0x3fc00000;
      auVar18 = vfmadd231ps_fma(auVar174,auVar201,auVar8);
      fVar124 = auVar18._0_4_;
      fVar101 = auVar18._4_4_;
      auVar19._4_4_ = fVar101 * auVar99._4_4_;
      auVar19._0_4_ = fVar124 * auVar99._0_4_;
      fVar103 = auVar18._8_4_;
      auVar19._8_4_ = fVar103 * auVar99._8_4_;
      fVar105 = auVar18._12_4_;
      auVar19._12_4_ = fVar105 * auVar99._12_4_;
      auVar19._16_4_ = auVar99._16_4_ * 0.0;
      auVar19._20_4_ = auVar99._20_4_ * 0.0;
      auVar19._24_4_ = auVar99._24_4_ * 0.0;
      auVar19._28_4_ = 0;
      auVar28._4_4_ = fVar101 * -auVar112._4_4_;
      auVar28._0_4_ = fVar124 * -auVar112._0_4_;
      auVar28._8_4_ = fVar103 * -auVar112._8_4_;
      auVar28._12_4_ = fVar105 * -auVar112._12_4_;
      auVar28._16_4_ = -auVar112._16_4_ * 0.0;
      auVar28._20_4_ = -auVar112._20_4_ * 0.0;
      auVar28._24_4_ = -auVar112._24_4_ * 0.0;
      auVar28._28_4_ = auVar8._28_4_;
      auVar18 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar134,auVar134);
      auVar8 = vrsqrtps_avx(ZEXT1632(auVar18));
      auVar29._28_4_ = auVar15._4_4_;
      auVar29._0_28_ =
           ZEXT1628(CONCAT412(fVar105 * 0.0,
                              CONCAT48(fVar103 * 0.0,CONCAT44(fVar101 * 0.0,fVar124 * 0.0))));
      fVar124 = auVar8._0_4_;
      fVar101 = auVar8._4_4_;
      fVar103 = auVar8._8_4_;
      fVar105 = auVar8._12_4_;
      fVar106 = auVar8._16_4_;
      fVar107 = auVar8._20_4_;
      fVar108 = auVar8._24_4_;
      auVar194._0_4_ = fVar124 * fVar124 * fVar124 * auVar18._0_4_ * -0.5;
      auVar194._4_4_ = fVar101 * fVar101 * fVar101 * auVar18._4_4_ * -0.5;
      auVar194._8_4_ = fVar103 * fVar103 * fVar103 * auVar18._8_4_ * -0.5;
      auVar194._12_4_ = fVar105 * fVar105 * fVar105 * auVar18._12_4_ * -0.5;
      auVar194._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
      auVar194._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
      auVar194._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar194._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar194,auVar201,auVar8);
      fVar124 = auVar15._0_4_;
      auVar190._0_4_ = auVar134._0_4_ * fVar124;
      fVar101 = auVar15._4_4_;
      auVar190._4_4_ = auVar134._4_4_ * fVar101;
      fVar103 = auVar15._8_4_;
      auVar190._8_4_ = auVar134._8_4_ * fVar103;
      fVar105 = auVar15._12_4_;
      auVar190._12_4_ = auVar134._12_4_ * fVar105;
      auVar190._16_4_ = auVar134._16_4_ * 0.0;
      auVar190._20_4_ = auVar134._20_4_ * 0.0;
      auVar190._24_4_ = auVar134._24_4_ * 0.0;
      auVar190._28_4_ = 0;
      auVar8._4_4_ = fVar101 * -auVar121._4_4_;
      auVar8._0_4_ = fVar124 * -auVar121._0_4_;
      auVar8._8_4_ = fVar103 * -auVar121._8_4_;
      auVar8._12_4_ = fVar105 * -auVar121._12_4_;
      auVar8._16_4_ = -auVar121._16_4_ * 0.0;
      auVar8._20_4_ = -auVar121._20_4_ * 0.0;
      auVar8._24_4_ = -auVar121._24_4_ * 0.0;
      auVar8._28_4_ = auVar112._28_4_ ^ 0x80000000;
      auVar30._28_4_ = 0xbf000000;
      auVar30._0_28_ =
           ZEXT1628(CONCAT412(fVar105 * 0.0,
                              CONCAT48(fVar103 * 0.0,CONCAT44(fVar101 * 0.0,fVar124 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar16),auVar113);
      auVar121 = ZEXT1632(auVar16);
      auVar18 = vfmadd213ps_fma(auVar28,auVar121,local_340);
      auVar92 = vfmadd213ps_fma(auVar29,auVar121,ZEXT1632(auVar14));
      auVar111 = vfnmadd213ps_fma(auVar19,auVar121,auVar113);
      auVar91 = vfmadd213ps_fma(auVar190,ZEXT1632(auVar17),local_300);
      auVar138 = vfnmadd213ps_fma(auVar28,auVar121,local_340);
      auVar121 = ZEXT1632(auVar17);
      auVar126 = vfmadd213ps_fma(auVar8,auVar121,local_320);
      local_420 = ZEXT1632(auVar16);
      auVar109 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_420,auVar29);
      auVar14 = vfmadd213ps_fma(auVar30,auVar121,ZEXT1632(auVar146));
      auVar143 = vfnmadd213ps_fma(auVar190,auVar121,local_300);
      auVar89 = vfnmadd213ps_fma(auVar8,auVar121,local_320);
      local_440 = ZEXT1632(auVar17);
      auVar142 = vfnmadd231ps_fma(ZEXT1632(auVar146),local_440,auVar30);
      auVar121 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar138));
      auVar134 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar109));
      auVar113._4_4_ = auVar109._4_4_ * auVar121._4_4_;
      auVar113._0_4_ = auVar109._0_4_ * auVar121._0_4_;
      auVar113._8_4_ = auVar109._8_4_ * auVar121._8_4_;
      auVar113._12_4_ = auVar109._12_4_ * auVar121._12_4_;
      auVar113._16_4_ = auVar121._16_4_ * 0.0;
      auVar113._20_4_ = auVar121._20_4_ * 0.0;
      auVar113._24_4_ = auVar121._24_4_ * 0.0;
      auVar113._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar138),auVar134);
      auVar31._4_4_ = auVar134._4_4_ * auVar111._4_4_;
      auVar31._0_4_ = auVar134._0_4_ * auVar111._0_4_;
      auVar31._8_4_ = auVar134._8_4_ * auVar111._8_4_;
      auVar31._12_4_ = auVar134._12_4_ * auVar111._12_4_;
      auVar31._16_4_ = auVar134._16_4_ * 0.0;
      auVar31._20_4_ = auVar134._20_4_ * 0.0;
      auVar31._24_4_ = auVar134._24_4_ * 0.0;
      auVar31._28_4_ = auVar134._28_4_;
      auVar134 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar111));
      auVar146 = vfmsub231ps_fma(auVar31,ZEXT1632(auVar109),auVar134);
      auVar32._4_4_ = auVar138._4_4_ * auVar134._4_4_;
      auVar32._0_4_ = auVar138._0_4_ * auVar134._0_4_;
      auVar32._8_4_ = auVar138._8_4_ * auVar134._8_4_;
      auVar32._12_4_ = auVar138._12_4_ * auVar134._12_4_;
      auVar32._16_4_ = auVar134._16_4_ * 0.0;
      auVar32._20_4_ = auVar134._20_4_ * 0.0;
      auVar32._24_4_ = auVar134._24_4_ * 0.0;
      auVar32._28_4_ = auVar134._28_4_;
      auVar99 = ZEXT1632(auVar111);
      auVar17 = vfmsub231ps_fma(auVar32,auVar99,auVar121);
      auVar121 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar121,ZEXT1632(auVar146));
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar121,ZEXT1632(auVar16));
      auVar174 = vcmpps_avx(ZEXT1632(auVar146),ZEXT1232(ZEXT412(0)) << 0x20,2);
      local_760 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar15),auVar174);
      local_780 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar18),auVar174);
      auVar121 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar92),auVar174);
      auVar134 = vblendvps_avx(auVar99,ZEXT1632(auVar91),auVar174);
      auVar112 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar126),auVar174);
      auVar8 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar14),auVar174);
      auVar99 = vblendvps_avx(ZEXT1632(auVar91),auVar99,auVar174);
      auVar9 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar138),auVar174);
      auVar146 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
      local_7a0 = ZEXT1632(auVar146);
      auVar13 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar109),auVar174);
      auVar19 = vsubps_avx(auVar99,local_760);
      auVar9 = vsubps_avx(auVar9,local_780);
      auVar94 = vsubps_avx(auVar13,auVar121);
      auVar21 = vsubps_avx(local_760,auVar134);
      auVar22 = vsubps_avx(local_780,auVar112);
      auVar20 = vsubps_avx(auVar121,auVar8);
      auVar33._4_4_ = auVar94._4_4_ * local_760._4_4_;
      auVar33._0_4_ = auVar94._0_4_ * local_760._0_4_;
      auVar33._8_4_ = auVar94._8_4_ * local_760._8_4_;
      auVar33._12_4_ = auVar94._12_4_ * local_760._12_4_;
      auVar33._16_4_ = auVar94._16_4_ * local_760._16_4_;
      auVar33._20_4_ = auVar94._20_4_ * local_760._20_4_;
      auVar33._24_4_ = auVar94._24_4_ * local_760._24_4_;
      auVar33._28_4_ = auVar13._28_4_;
      auVar14 = vfmsub231ps_fma(auVar33,auVar121,auVar19);
      auVar34._4_4_ = auVar19._4_4_ * local_780._4_4_;
      auVar34._0_4_ = auVar19._0_4_ * local_780._0_4_;
      auVar34._8_4_ = auVar19._8_4_ * local_780._8_4_;
      auVar34._12_4_ = auVar19._12_4_ * local_780._12_4_;
      auVar34._16_4_ = auVar19._16_4_ * local_780._16_4_;
      auVar34._20_4_ = auVar19._20_4_ * local_780._20_4_;
      auVar34._24_4_ = auVar19._24_4_ * local_780._24_4_;
      auVar34._28_4_ = auVar99._28_4_;
      auVar15 = vfmsub231ps_fma(auVar34,local_760,auVar9);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar96._0_4_ = auVar9._0_4_ * auVar121._0_4_;
      auVar96._4_4_ = auVar9._4_4_ * auVar121._4_4_;
      auVar96._8_4_ = auVar9._8_4_ * auVar121._8_4_;
      auVar96._12_4_ = auVar9._12_4_ * auVar121._12_4_;
      auVar96._16_4_ = auVar9._16_4_ * auVar121._16_4_;
      auVar96._20_4_ = auVar9._20_4_ * auVar121._20_4_;
      auVar96._24_4_ = auVar9._24_4_ * auVar121._24_4_;
      auVar96._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar96,local_780,auVar94);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar97._0_4_ = auVar20._0_4_ * auVar134._0_4_;
      auVar97._4_4_ = auVar20._4_4_ * auVar134._4_4_;
      auVar97._8_4_ = auVar20._8_4_ * auVar134._8_4_;
      auVar97._12_4_ = auVar20._12_4_ * auVar134._12_4_;
      auVar97._16_4_ = auVar20._16_4_ * auVar134._16_4_;
      auVar97._20_4_ = auVar20._20_4_ * auVar134._20_4_;
      auVar97._24_4_ = auVar20._24_4_ * auVar134._24_4_;
      auVar97._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar97,auVar21,auVar8);
      auVar117._0_4_ = auVar22._0_4_ * auVar8._0_4_;
      auVar117._4_4_ = auVar22._4_4_ * auVar8._4_4_;
      auVar117._8_4_ = auVar22._8_4_ * auVar8._8_4_;
      auVar117._12_4_ = auVar22._12_4_ * auVar8._12_4_;
      auVar117._16_4_ = auVar22._16_4_ * auVar8._16_4_;
      auVar117._20_4_ = auVar22._20_4_ * auVar8._20_4_;
      auVar117._24_4_ = auVar22._24_4_ * auVar8._24_4_;
      auVar117._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar117,auVar112,auVar20);
      auVar35._4_4_ = auVar21._4_4_ * auVar112._4_4_;
      auVar35._0_4_ = auVar21._0_4_ * auVar112._0_4_;
      auVar35._8_4_ = auVar21._8_4_ * auVar112._8_4_;
      auVar35._12_4_ = auVar21._12_4_ * auVar112._12_4_;
      auVar35._16_4_ = auVar21._16_4_ * auVar112._16_4_;
      auVar35._20_4_ = auVar21._20_4_ * auVar112._20_4_;
      auVar35._24_4_ = auVar21._24_4_ * auVar112._24_4_;
      auVar35._28_4_ = auVar112._28_4_;
      auVar17 = vfmsub231ps_fma(auVar35,auVar22,auVar134);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar112 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar112 = vcmpps_avx(auVar112,ZEXT832(0) << 0x20,2);
      auVar14 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
      auVar146 = vpand_avx(auVar14,auVar146);
      auVar112 = vpmovsxwd_avx2(auVar146);
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0x7f,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0xbf,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar112[0x1f]) {
LAB_01123fac:
        auVar150._8_8_ = uStack_498;
        auVar150._0_8_ = local_4a0;
        auVar150._16_8_ = uStack_490;
        auVar150._24_8_ = uStack_488;
        auVar187 = ZEXT3264(auVar186);
        auVar198 = ZEXT3264(auVar120);
      }
      else {
        local_7a0 = ZEXT1632(auVar146);
        auVar118._0_4_ = auVar9._0_4_ * auVar20._0_4_;
        auVar118._4_4_ = auVar9._4_4_ * auVar20._4_4_;
        auVar118._8_4_ = auVar9._8_4_ * auVar20._8_4_;
        auVar118._12_4_ = auVar9._12_4_ * auVar20._12_4_;
        auVar118._16_4_ = auVar9._16_4_ * auVar20._16_4_;
        auVar118._20_4_ = auVar9._20_4_ * auVar20._20_4_;
        auVar118._24_4_ = auVar9._24_4_ * auVar20._24_4_;
        auVar118._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar118,auVar22,auVar94);
        auVar36._4_4_ = auVar94._4_4_ * auVar21._4_4_;
        auVar36._0_4_ = auVar94._0_4_ * auVar21._0_4_;
        auVar36._8_4_ = auVar94._8_4_ * auVar21._8_4_;
        auVar36._12_4_ = auVar94._12_4_ * auVar21._12_4_;
        auVar36._16_4_ = auVar94._16_4_ * auVar21._16_4_;
        auVar36._20_4_ = auVar94._20_4_ * auVar21._20_4_;
        auVar36._24_4_ = auVar94._24_4_ * auVar21._24_4_;
        auVar36._28_4_ = auVar134._28_4_;
        auVar18 = vfmsub231ps_fma(auVar36,auVar19,auVar20);
        auVar37._4_4_ = auVar19._4_4_ * auVar22._4_4_;
        auVar37._0_4_ = auVar19._0_4_ * auVar22._0_4_;
        auVar37._8_4_ = auVar19._8_4_ * auVar22._8_4_;
        auVar37._12_4_ = auVar19._12_4_ * auVar22._12_4_;
        auVar37._16_4_ = auVar19._16_4_ * auVar22._16_4_;
        auVar37._20_4_ = auVar19._20_4_ * auVar22._20_4_;
        auVar37._24_4_ = auVar19._24_4_ * auVar22._24_4_;
        auVar37._28_4_ = auVar19._28_4_;
        auVar91 = vfmsub231ps_fma(auVar37,auVar21,auVar9);
        auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar18),ZEXT1632(auVar91));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar92),ZEXT832(0) << 0x20);
        auVar134 = vrcpps_avx(ZEXT1632(auVar17));
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = 0x3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar191._16_4_ = 0x3f800000;
        auVar191._20_4_ = 0x3f800000;
        auVar191._24_4_ = 0x3f800000;
        auVar191._28_4_ = 0x3f800000;
        auVar14 = vfnmadd213ps_fma(auVar134,ZEXT1632(auVar17),auVar191);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar134,auVar134);
        auVar38._4_4_ = auVar91._4_4_ * auVar121._4_4_;
        auVar38._0_4_ = auVar91._0_4_ * auVar121._0_4_;
        auVar38._8_4_ = auVar91._8_4_ * auVar121._8_4_;
        auVar38._12_4_ = auVar91._12_4_ * auVar121._12_4_;
        auVar38._16_4_ = auVar121._16_4_ * 0.0;
        auVar38._20_4_ = auVar121._20_4_ * 0.0;
        auVar38._24_4_ = auVar121._24_4_ * 0.0;
        auVar38._28_4_ = auVar121._28_4_;
        auVar18 = vfmadd231ps_fma(auVar38,ZEXT1632(auVar18),local_780);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar92),local_760);
        fVar101 = auVar14._0_4_;
        fVar103 = auVar14._4_4_;
        fVar105 = auVar14._8_4_;
        fVar106 = auVar14._12_4_;
        auVar39._28_4_ = auVar8._28_4_;
        auVar39._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * auVar18._12_4_,
                                CONCAT48(fVar105 * auVar18._8_4_,
                                         CONCAT44(fVar103 * auVar18._4_4_,fVar101 * auVar18._0_4_)))
                     );
        auVar119._8_8_ = local_660._0_8_;
        auVar119._0_8_ = local_660._0_8_;
        auVar119._16_8_ = local_660._0_8_;
        auVar119._24_8_ = local_660._0_8_;
        fVar124 = ray->tfar;
        auVar149._4_4_ = fVar124;
        auVar149._0_4_ = fVar124;
        auVar149._8_4_ = fVar124;
        auVar149._12_4_ = fVar124;
        auVar149._16_4_ = fVar124;
        auVar149._20_4_ = fVar124;
        auVar149._24_4_ = fVar124;
        auVar149._28_4_ = fVar124;
        auVar121 = vcmpps_avx(auVar119,auVar39,2);
        auVar134 = vcmpps_avx(auVar39,auVar149,2);
        auVar121 = vandps_avx(auVar134,auVar121);
        auVar14 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar146 = vpand_avx(auVar14,auVar146);
        auVar121 = vpmovsxwd_avx2(auVar146);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar121[0x1f]) goto LAB_01123fac;
        auVar121 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar17),4);
        auVar14 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar146 = vpand_avx(auVar146,auVar14);
        auVar121 = vpmovsxwd_avx2(auVar146);
        auVar150._8_8_ = uStack_498;
        auVar150._0_8_ = local_4a0;
        auVar150._16_8_ = uStack_490;
        auVar150._24_8_ = uStack_488;
        auVar187 = ZEXT3264(auVar186);
        auVar198 = ZEXT3264(auVar120);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar120 = ZEXT1632(CONCAT412(fVar106 * auVar15._12_4_,
                                        CONCAT48(fVar105 * auVar15._8_4_,
                                                 CONCAT44(fVar103 * auVar15._4_4_,
                                                          fVar101 * auVar15._0_4_))));
          auVar134 = ZEXT1632(CONCAT412(fVar106 * auVar16._12_4_,
                                        CONCAT48(fVar105 * auVar16._8_4_,
                                                 CONCAT44(fVar103 * auVar16._4_4_,
                                                          fVar101 * auVar16._0_4_))));
          auVar162._8_4_ = 0x3f800000;
          auVar162._0_8_ = 0x3f8000003f800000;
          auVar162._12_4_ = 0x3f800000;
          auVar162._16_4_ = 0x3f800000;
          auVar162._20_4_ = 0x3f800000;
          auVar162._24_4_ = 0x3f800000;
          auVar162._28_4_ = 0x3f800000;
          auVar186 = vsubps_avx(auVar162,auVar120);
          auVar186 = vblendvps_avx(auVar186,auVar120,auVar174);
          auVar187 = ZEXT3264(auVar186);
          auVar186 = vsubps_avx(auVar162,auVar134);
          local_3a0 = vblendvps_avx(auVar186,auVar134,auVar174);
          auVar198 = ZEXT3264(auVar39);
          auVar150 = auVar121;
        }
      }
      auVar203 = ZEXT3264(local_680);
      auVar196 = ZEXT3264(local_640);
      auVar178 = ZEXT3264(local_6a0);
      auVar204 = ZEXT3264(local_5c0);
      if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar150 >> 0x7f,0) == '\0') &&
            (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar150 >> 0xbf,0) == '\0') &&
          (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar150[0x1f]) goto LAB_01122d91;
      auVar121 = vsubps_avx(local_440,local_420);
      local_280 = auVar187._0_32_;
      auVar146 = vfmadd213ps_fma(auVar121,local_280,local_420);
      fVar124 = local_7b8->depth_scale;
      auVar186._4_4_ = (auVar146._4_4_ + auVar146._4_4_) * fVar124;
      auVar186._0_4_ = (auVar146._0_4_ + auVar146._0_4_) * fVar124;
      auVar186._8_4_ = (auVar146._8_4_ + auVar146._8_4_) * fVar124;
      auVar186._12_4_ = (auVar146._12_4_ + auVar146._12_4_) * fVar124;
      auVar186._16_4_ = fVar124 * 0.0;
      auVar186._20_4_ = fVar124 * 0.0;
      auVar186._24_4_ = fVar124 * 0.0;
      auVar186._28_4_ = 0;
      local_240 = auVar198._0_32_;
      auVar121 = vcmpps_avx(local_240,auVar186,6);
      auVar186 = auVar150 & auVar121;
      auVar167 = ZEXT3264(CONCAT428(local_5a0,
                                    CONCAT424(local_5a0,
                                              CONCAT420(local_5a0,
                                                        CONCAT416(local_5a0,
                                                                  CONCAT412(local_5a0,
                                                                            CONCAT48(local_5a0,
                                                                                     CONCAT44(
                                                  local_5a0,local_5a0))))))));
      auVar169 = ZEXT3264(local_620);
      auVar141 = ZEXT3264(local_560);
      if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar186 >> 0x7f,0) == '\0') &&
            (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar186 >> 0xbf,0) == '\0') &&
          (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar186[0x1f]) {
LAB_01122e52:
        pRVar79 = (RTCIntersectArguments *)0x0;
      }
      else {
        auVar120._8_4_ = 0xbf800000;
        auVar120._0_8_ = 0xbf800000bf800000;
        auVar120._12_4_ = 0xbf800000;
        auVar120._16_4_ = 0xbf800000;
        auVar120._20_4_ = 0xbf800000;
        auVar120._24_4_ = 0xbf800000;
        auVar120._28_4_ = 0xbf800000;
        auVar132._8_4_ = 0x40000000;
        auVar132._0_8_ = 0x4000000040000000;
        auVar132._12_4_ = 0x40000000;
        auVar132._16_4_ = 0x40000000;
        auVar132._20_4_ = 0x40000000;
        auVar132._24_4_ = 0x40000000;
        auVar132._28_4_ = 0x40000000;
        auVar146 = vfmadd213ps_fma(local_3a0,auVar132,auVar120);
        local_260 = ZEXT1632(auVar146);
        local_220 = 0;
        local_21c = iVar11;
        local_210 = *(undefined8 *)pPVar1;
        uStack_208 = *(undefined8 *)(pPVar1 + 8);
        local_200 = local_520._0_8_;
        uStack_1f8 = local_520._8_8_;
        local_1f0 = local_530._0_8_;
        uStack_1e8 = local_530._8_8_;
        local_3a0 = ZEXT1632(auVar146);
        auVar186 = local_3a0;
        if ((pGVar12->mask & ray->mask) == 0) {
          pRVar79 = (RTCIntersectArguments *)0x0;
          auVar141 = ZEXT3264(local_560);
          local_530 = auVar110;
          local_520 = auVar90;
        }
        else {
          pRVar79 = context->args;
          auVar141 = ZEXT3264(local_560);
          if ((pRVar79->filter != (RTCFilterFunctionN)0x0) ||
             (pRVar79 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar79 >> 8),1),
             local_530 = auVar110, local_520 = auVar90,
             pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar121 = vandps_avx(auVar121,auVar150);
            fVar124 = 1.0 / auVar115._0_4_;
            local_1a0[0] = fVar124 * (auVar187._0_4_ + 0.0);
            local_1a0[1] = fVar124 * (auVar187._4_4_ + 1.0);
            local_1a0[2] = fVar124 * (auVar187._8_4_ + 2.0);
            local_1a0[3] = fVar124 * (auVar187._12_4_ + 3.0);
            fStack_190 = fVar124 * (auVar187._16_4_ + 4.0);
            fStack_18c = fVar124 * (auVar187._20_4_ + 5.0);
            fStack_188 = fVar124 * (auVar187._24_4_ + 6.0);
            fStack_184 = auVar187._28_4_ + 7.0;
            local_3a0._0_8_ = auVar146._0_8_;
            local_3a0._8_8_ = auVar146._8_8_;
            local_180 = local_3a0._0_8_;
            uStack_178 = local_3a0._8_8_;
            uStack_170 = 0;
            uStack_168 = 0;
            local_160 = local_240;
            uVar77 = vmovmskps_avx(auVar121);
            lVar87 = 0;
            uVar80 = CONCAT44((int)((ulong)pRVar79 >> 0x20),uVar77);
            for (uVar81 = uVar80; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
              lVar87 = lVar87 + 1;
            }
            local_6c0 = local_280;
            local_6e0 = local_240;
            local_530 = auVar110;
            local_520 = auVar90;
            local_3a0 = auVar186;
            _local_360 = auVar114;
            while (uVar80 != 0) {
              local_7a0._0_8_ = uVar80;
              local_504 = local_1a0[lVar87];
              local_500 = *(undefined4 *)((long)&local_180 + lVar87 * 4);
              local_780._0_4_ = ray->tfar;
              local_760._0_8_ = lVar87;
              ray->tfar = *(float *)(local_160 + lVar87 * 4);
              local_5f0.context = context->user;
              fVar125 = 1.0 - local_504;
              auVar146 = ZEXT416((uint)(local_504 * fVar125 * 4.0));
              auVar14 = vfnmsub213ss_fma(ZEXT416((uint)local_504),ZEXT416((uint)local_504),auVar146)
              ;
              auVar146 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),auVar146);
              fVar125 = fVar125 * -fVar125 * 0.5;
              fVar124 = auVar14._0_4_ * 0.5;
              fVar102 = auVar146._0_4_ * 0.5;
              fVar104 = local_504 * local_504 * 0.5;
              auVar144._0_4_ = fVar104 * (float)local_4c0._0_4_;
              auVar144._4_4_ = fVar104 * (float)local_4c0._4_4_;
              auVar144._8_4_ = fVar104 * fStack_4b8;
              auVar144._12_4_ = fVar104 * fStack_4b4;
              auVar127._4_4_ = fVar102;
              auVar127._0_4_ = fVar102;
              auVar127._8_4_ = fVar102;
              auVar127._12_4_ = fVar102;
              auVar146 = vfmadd132ps_fma(auVar127,auVar144,local_530);
              auVar145._4_4_ = fVar124;
              auVar145._0_4_ = fVar124;
              auVar145._8_4_ = fVar124;
              auVar145._12_4_ = fVar124;
              auVar146 = vfmadd132ps_fma(auVar145,auVar146,local_520);
              auVar128._4_4_ = fVar125;
              auVar128._0_4_ = fVar125;
              auVar128._8_4_ = fVar125;
              auVar128._12_4_ = fVar125;
              auVar71._8_8_ = uStack_5f8;
              auVar71._0_8_ = local_600;
              auVar146 = vfmadd132ps_fma(auVar128,auVar146,auVar71);
              local_510 = vmovlps_avx(auVar146);
              local_508 = vextractps_avx(auVar146,2);
              local_4fc = local_7a4;
              local_4f8 = (int)local_6e8;
              local_4f4 = (local_5f0.context)->instID[0];
              local_4f0 = (local_5f0.context)->instPrimID[0];
              local_7c4 = -1;
              local_5f0.valid = &local_7c4;
              local_5f0.geometryUserPtr = pGVar12->userPtr;
              local_5f0.ray = (RTCRayN *)ray;
              local_5f0.hit = (RTCHitN *)&local_510;
              local_5f0.N = 1;
              if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar12->occlusionFilterN)(&local_5f0), *local_5f0.valid != 0)) {
                p_Var82 = context->args->filter;
                if ((p_Var82 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar12->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var82)(&local_5f0), p_Var82 = (RTCFilterFunctionN)local_5f0.valid,
                       *local_5f0.valid != 0)))) {
                  pRVar79 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)p_Var82 >> 8),1);
                  auVar196 = ZEXT3264(local_640);
                  auVar178 = ZEXT3264(local_6a0);
                  auVar187 = ZEXT3264(local_6c0);
                  auVar198 = ZEXT3264(local_6e0);
                  auVar203 = ZEXT3264(local_680);
                  auVar204 = ZEXT3264(local_5c0);
                  auVar167 = ZEXT3264(CONCAT428(fStack_584,
                                                CONCAT424(fStack_588,
                                                          CONCAT420(fStack_58c,
                                                                    CONCAT416(fStack_590,
                                                                              CONCAT412(fStack_594,
                                                                                        CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
                  auVar169 = ZEXT3264(local_620);
                  auVar141 = ZEXT3264(local_560);
                  fVar125 = (float)local_580;
                  fVar102 = local_580._4_4_;
                  fVar104 = (float)uStack_578;
                  fVar205 = uStack_578._4_4_;
                  fVar206 = (float)uStack_570;
                  fVar207 = uStack_570._4_4_;
                  fVar208 = (float)uStack_568;
                  uStack_4d8 = uStack_4d8;
                  uStack_4d0 = uStack_4d0;
                  uStack_4c8 = uStack_4c8;
                  goto LAB_01122db5;
                }
              }
              ray->tfar = (float)local_780._0_4_;
              lVar87 = 0;
              uVar80 = local_7a0._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
              for (uVar81 = uVar80; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                lVar87 = lVar87 + 1;
              }
              auVar196 = ZEXT3264(local_640);
              auVar178 = ZEXT3264(local_6a0);
              auVar187 = ZEXT3264(local_6c0);
              auVar198 = ZEXT3264(local_6e0);
              auVar203 = ZEXT3264(local_680);
              auVar204 = ZEXT3264(local_5c0);
              auVar167 = ZEXT3264(CONCAT428(fStack_584,
                                            CONCAT424(fStack_588,
                                                      CONCAT420(fStack_58c,
                                                                CONCAT416(fStack_590,
                                                                          CONCAT412(fStack_594,
                                                                                    CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
              auVar169 = ZEXT3264(local_620);
              auVar141 = ZEXT3264(local_560);
              fVar125 = (float)local_580;
              fVar102 = local_580._4_4_;
              fVar104 = (float)uStack_578;
              fVar205 = uStack_578._4_4_;
              fVar206 = (float)uStack_570;
              fVar207 = uStack_570._4_4_;
              fVar208 = (float)uStack_568;
            }
            goto LAB_01122e52;
          }
        }
      }
    }
LAB_01122db5:
    auVar123 = ZEXT3264(local_720);
    auVar136 = ZEXT1664(local_740._0_16_);
    if (8 < iVar11) {
      local_380._4_4_ = iVar11;
      local_380._0_4_ = iVar11;
      local_380._8_4_ = iVar11;
      local_380._12_4_ = iVar11;
      local_380._16_4_ = iVar11;
      local_380._20_4_ = iVar11;
      local_380._24_4_ = iVar11;
      local_380._28_4_ = iVar11;
      local_100 = local_740._0_4_;
      uStack_fc = local_100;
      uStack_f8 = local_100;
      uStack_f4 = local_100;
      uStack_f0 = local_100;
      uStack_ec = local_100;
      uStack_e8 = local_100;
      uStack_e4 = local_100;
      local_120 = local_660._0_8_;
      uStack_118 = local_660._0_8_;
      uStack_110 = local_660._0_8_;
      uStack_108 = local_660._0_8_;
      local_140._0_4_ = 1.0 / (float)local_3e0._0_4_;
      local_140._4_4_ = local_140._0_4_;
      fStack_138 = (float)local_140._0_4_;
      fStack_134 = (float)local_140._0_4_;
      fStack_130 = (float)local_140._0_4_;
      fStack_12c = (float)local_140._0_4_;
      fStack_128 = (float)local_140._0_4_;
      register0x0000121c = local_140._0_4_;
      auVar100 = ZEXT3264(_local_140);
      lVar87 = 8;
      local_6c0 = auVar187._0_32_;
      local_6e0 = auVar198._0_32_;
LAB_011232a7:
      if (lVar87 < local_7c0) {
        local_760._0_4_ = (int)pRVar79;
        auVar174 = auVar178._0_32_;
        auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 * 4 + lVar85);
        local_740 = *(undefined1 (*) [32])(lVar85 + 0x21fffac + lVar87 * 4);
        auVar186 = *(undefined1 (*) [32])(lVar85 + 0x2200430 + lVar87 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar85 + 0x22008b4 + lVar87 * 4);
        fVar124 = *(float *)*pauVar2;
        fVar101 = *(float *)(*pauVar2 + 4);
        fVar103 = *(float *)(*pauVar2 + 8);
        fVar105 = *(float *)(*pauVar2 + 0xc);
        fVar106 = *(float *)(*pauVar2 + 0x10);
        fVar107 = *(float *)(*pauVar2 + 0x14);
        fVar108 = *(float *)(*pauVar2 + 0x18);
        auVar75 = *(undefined1 (*) [28])*pauVar2;
        auVar187._0_4_ = fVar124 * auVar167._0_4_;
        auVar187._4_4_ = fVar101 * auVar167._4_4_;
        auVar187._8_4_ = fVar103 * auVar167._8_4_;
        auVar187._12_4_ = fVar105 * auVar167._12_4_;
        auVar187._16_4_ = fVar106 * auVar167._16_4_;
        auVar187._20_4_ = fVar107 * auVar167._20_4_;
        auVar187._28_36_ = auVar100._28_36_;
        auVar187._24_4_ = fVar108 * auVar167._24_4_;
        auVar137._0_4_ = fVar124 * fVar125;
        auVar137._4_4_ = fVar101 * fVar102;
        auVar137._8_4_ = fVar103 * fVar104;
        auVar137._12_4_ = fVar105 * fVar205;
        auVar137._16_4_ = fVar106 * fVar206;
        auVar137._20_4_ = fVar107 * fVar207;
        auVar137._28_36_ = auVar136._28_36_;
        auVar137._24_4_ = fVar108 * fVar208;
        auVar146 = vfmadd231ps_fma(auVar187._0_32_,auVar186,auVar203._0_32_);
        auVar14 = vfmadd231ps_fma(auVar137._0_32_,auVar186,auVar204._0_32_);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),local_740,auVar169._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_740,auVar123._0_32_);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar121,auVar141._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_400);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 * 4 + lVar85);
        auVar134 = *(undefined1 (*) [32])(lVar85 + 0x22023cc + lVar87 * 4);
        auVar112 = *(undefined1 (*) [32])(lVar85 + 0x2202850 + lVar87 * 4);
        pfVar3 = (float *)(lVar85 + 0x2202cd4 + lVar87 * 4);
        fVar70 = *pfVar3;
        fVar188 = pfVar3[1];
        fVar192 = pfVar3[2];
        fVar170 = pfVar3[3];
        fVar179 = pfVar3[4];
        fVar180 = pfVar3[5];
        fVar181 = pfVar3[6];
        auVar40._4_4_ = fVar188 * auVar167._4_4_;
        auVar40._0_4_ = fVar70 * auVar167._0_4_;
        auVar40._8_4_ = fVar192 * auVar167._8_4_;
        auVar40._12_4_ = fVar170 * auVar167._12_4_;
        auVar40._16_4_ = fVar179 * auVar167._16_4_;
        auVar40._20_4_ = fVar180 * auVar167._20_4_;
        auVar40._24_4_ = fVar181 * auVar167._24_4_;
        auVar40._28_4_ = auVar121._28_4_;
        auVar136._0_4_ = fVar70 * fVar125;
        auVar136._4_4_ = fVar188 * fVar102;
        auVar136._8_4_ = fVar192 * fVar104;
        auVar136._12_4_ = fVar170 * fVar205;
        auVar136._16_4_ = fVar179 * fVar206;
        auVar136._20_4_ = fVar180 * fVar207;
        auVar136._28_36_ = auVar167._28_36_;
        auVar136._24_4_ = fVar181 * fVar208;
        auVar15 = vfmadd231ps_fma(auVar40,auVar112,auVar203._0_32_);
        auVar16 = vfmadd231ps_fma(auVar136._0_32_,auVar112,auVar204._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar134,auVar169._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar134,auVar123._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar120,auVar141._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,local_400);
        local_320 = ZEXT1632(auVar15);
        local_340 = ZEXT1632(auVar146);
        local_440 = vsubps_avx(local_320,local_340);
        local_300 = ZEXT1632(auVar16);
        local_420 = ZEXT1632(auVar14);
        _local_360 = vsubps_avx(local_300,local_420);
        auVar98._0_4_ = auVar14._0_4_ * local_440._0_4_;
        auVar98._4_4_ = auVar14._4_4_ * local_440._4_4_;
        auVar98._8_4_ = auVar14._8_4_ * local_440._8_4_;
        auVar98._12_4_ = auVar14._12_4_ * local_440._12_4_;
        auVar98._16_4_ = local_440._16_4_ * 0.0;
        auVar98._20_4_ = local_440._20_4_ * 0.0;
        auVar98._24_4_ = local_440._24_4_ * 0.0;
        auVar98._28_4_ = 0;
        fVar125 = local_360._0_4_;
        auVar198._0_4_ = fVar125 * auVar146._0_4_;
        fVar102 = local_360._4_4_;
        auVar198._4_4_ = fVar102 * auVar146._4_4_;
        fVar104 = local_360._8_4_;
        auVar198._8_4_ = fVar104 * auVar146._8_4_;
        fVar205 = local_360._12_4_;
        auVar198._12_4_ = fVar205 * auVar146._12_4_;
        fVar206 = local_360._16_4_;
        auVar198._16_4_ = fVar206 * 0.0;
        fVar207 = local_360._20_4_;
        auVar198._20_4_ = fVar207 * 0.0;
        auVar198._28_36_ = auVar123._28_36_;
        fVar208 = local_360._24_4_;
        auVar198._24_4_ = fVar208 * 0.0;
        auVar99 = vsubps_avx(auVar98,auVar198._0_32_);
        _local_460 = *pauVar2;
        auVar13 = _local_460;
        auVar133._0_4_ = fVar124 * (float)local_e0;
        auVar133._4_4_ = fVar101 * local_e0._4_4_;
        auVar133._8_4_ = fVar103 * (float)uStack_d8;
        auVar133._12_4_ = fVar105 * uStack_d8._4_4_;
        auVar133._16_4_ = fVar106 * (float)uStack_d0;
        auVar133._20_4_ = fVar107 * uStack_d0._4_4_;
        auVar133._24_4_ = fVar108 * (float)uStack_c8;
        auVar133._28_4_ = 0;
        auVar146 = vfmadd231ps_fma(auVar133,auVar186,local_c0);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),local_a0,local_740);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),local_80,auVar121);
        auVar136 = ZEXT1664(auVar146);
        auVar41._4_4_ = fVar188 * local_e0._4_4_;
        auVar41._0_4_ = fVar70 * (float)local_e0;
        auVar41._8_4_ = fVar192 * (float)uStack_d8;
        auVar41._12_4_ = fVar170 * uStack_d8._4_4_;
        auVar41._16_4_ = fVar179 * (float)uStack_d0;
        auVar41._20_4_ = fVar180 * uStack_d0._4_4_;
        auVar41._24_4_ = fVar181 * (float)uStack_c8;
        auVar41._28_4_ = uStack_c8._4_4_;
        auVar14 = vfmadd231ps_fma(auVar41,auVar112,local_c0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,local_a0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar120,local_80);
        auVar42._4_4_ = fVar102 * fVar102;
        auVar42._0_4_ = fVar125 * fVar125;
        auVar42._8_4_ = fVar104 * fVar104;
        auVar42._12_4_ = fVar205 * fVar205;
        auVar42._16_4_ = fVar206 * fVar206;
        auVar42._20_4_ = fVar207 * fVar207;
        auVar42._24_4_ = fVar208 * fVar208;
        auVar42._28_4_ = local_80._28_4_;
        auVar15 = vfmadd231ps_fma(auVar42,local_440,local_440);
        auVar8 = vmaxps_avx(ZEXT1632(auVar146),ZEXT1632(auVar14));
        auVar175._0_4_ = auVar8._0_4_ * auVar8._0_4_ * auVar15._0_4_;
        auVar175._4_4_ = auVar8._4_4_ * auVar8._4_4_ * auVar15._4_4_;
        auVar175._8_4_ = auVar8._8_4_ * auVar8._8_4_ * auVar15._8_4_;
        auVar175._12_4_ = auVar8._12_4_ * auVar8._12_4_ * auVar15._12_4_;
        auVar175._16_4_ = auVar8._16_4_ * auVar8._16_4_ * 0.0;
        auVar175._20_4_ = auVar8._20_4_ * auVar8._20_4_ * 0.0;
        auVar175._24_4_ = auVar8._24_4_ * auVar8._24_4_ * 0.0;
        auVar175._28_4_ = 0;
        auVar43._4_4_ = auVar99._4_4_ * auVar99._4_4_;
        auVar43._0_4_ = auVar99._0_4_ * auVar99._0_4_;
        auVar43._8_4_ = auVar99._8_4_ * auVar99._8_4_;
        auVar43._12_4_ = auVar99._12_4_ * auVar99._12_4_;
        auVar43._16_4_ = auVar99._16_4_ * auVar99._16_4_;
        auVar43._20_4_ = auVar99._20_4_ * auVar99._20_4_;
        auVar43._24_4_ = auVar99._24_4_ * auVar99._24_4_;
        auVar43._28_4_ = auVar99._28_4_;
        auVar8 = vcmpps_avx(auVar43,auVar175,2);
        local_220 = (int)lVar87;
        auVar176._4_4_ = local_220;
        auVar176._0_4_ = local_220;
        auVar176._8_4_ = local_220;
        auVar176._12_4_ = local_220;
        auVar176._16_4_ = local_220;
        auVar176._20_4_ = local_220;
        auVar176._24_4_ = local_220;
        auVar176._28_4_ = local_220;
        auVar99 = vpor_avx2(auVar176,_DAT_01fb4ba0);
        auVar100 = ZEXT3264(local_380);
        auVar9 = vpcmpgtd_avx2(local_380,auVar99);
        auVar99 = auVar9 & auVar8;
        fVar125 = (float)local_580;
        fVar102 = local_580._4_4_;
        fVar104 = (float)uStack_578;
        fVar205 = uStack_578._4_4_;
        fVar206 = (float)uStack_570;
        fVar207 = uStack_570._4_4_;
        fVar208 = (float)uStack_568;
        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar99 >> 0x7f,0) != '\0') ||
              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0xbf,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar99[0x1f] < '\0') {
          local_3e0 = vandps_avx(auVar9,auVar8);
          auVar44._4_4_ = local_4e0._4_4_ * fVar188;
          auVar44._0_4_ = (float)local_4e0 * fVar70;
          auVar44._8_4_ = (float)uStack_4d8 * fVar192;
          auVar44._12_4_ = uStack_4d8._4_4_ * fVar170;
          auVar44._16_4_ = (float)uStack_4d0 * fVar179;
          auVar44._20_4_ = uStack_4d0._4_4_ * fVar180;
          auVar44._24_4_ = (float)uStack_4c8 * fVar181;
          auVar44._28_4_ = auVar8._28_4_;
          auVar15 = vfmadd213ps_fma(auVar112,local_2e0,auVar44);
          auVar15 = vfmadd213ps_fma(auVar134,local_2c0,ZEXT1632(auVar15));
          auVar15 = vfmadd132ps_fma(auVar120,ZEXT1632(auVar15),local_480);
          local_460._0_4_ = auVar75._0_4_;
          local_460._4_4_ = auVar75._4_4_;
          fStack_458 = auVar75._8_4_;
          fStack_454 = auVar75._12_4_;
          fStack_450 = auVar75._16_4_;
          fStack_44c = auVar75._20_4_;
          fStack_448 = auVar75._24_4_;
          auVar45._4_4_ = local_4e0._4_4_ * (float)local_460._4_4_;
          auVar45._0_4_ = (float)local_4e0 * (float)local_460._0_4_;
          auVar45._8_4_ = (float)uStack_4d8 * fStack_458;
          auVar45._12_4_ = uStack_4d8._4_4_ * fStack_454;
          auVar45._16_4_ = (float)uStack_4d0 * fStack_450;
          auVar45._20_4_ = uStack_4d0._4_4_ * fStack_44c;
          auVar45._24_4_ = (float)uStack_4c8 * fStack_448;
          auVar45._28_4_ = auVar8._28_4_;
          auVar16 = vfmadd213ps_fma(auVar186,local_2e0,auVar45);
          auVar16 = vfmadd213ps_fma(local_740,local_2c0,ZEXT1632(auVar16));
          auVar186 = *(undefined1 (*) [32])(lVar85 + 0x2200d38 + lVar87 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar85 + 0x22011bc + lVar87 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar85 + 0x2201640 + lVar87 * 4);
          pfVar4 = (float *)(lVar85 + 0x2201ac4 + lVar87 * 4);
          fVar124 = *pfVar4;
          fVar101 = pfVar4[1];
          fVar103 = pfVar4[2];
          fVar105 = pfVar4[3];
          fVar106 = pfVar4[4];
          fVar107 = pfVar4[5];
          fVar108 = pfVar4[6];
          auVar46._4_4_ = fStack_59c * fVar101;
          auVar46._0_4_ = local_5a0 * fVar124;
          auVar46._8_4_ = fStack_598 * fVar103;
          auVar46._12_4_ = fStack_594 * fVar105;
          auVar46._16_4_ = fStack_590 * fVar106;
          auVar46._20_4_ = fStack_58c * fVar107;
          auVar46._24_4_ = fStack_588 * fVar108;
          auVar46._28_4_ = pfVar3[7];
          auVar203._0_4_ = (float)local_580 * fVar124;
          auVar203._4_4_ = local_580._4_4_ * fVar101;
          auVar203._8_4_ = (float)uStack_578 * fVar103;
          auVar203._12_4_ = uStack_578._4_4_ * fVar105;
          auVar203._16_4_ = (float)uStack_570 * fVar106;
          auVar203._20_4_ = uStack_570._4_4_ * fVar107;
          auVar203._28_36_ = auVar196._28_36_;
          auVar203._24_4_ = (float)uStack_568 * fVar108;
          auVar47._4_4_ = fVar101 * local_4e0._4_4_;
          auVar47._0_4_ = fVar124 * (float)local_4e0;
          auVar47._8_4_ = fVar103 * (float)uStack_4d8;
          auVar47._12_4_ = fVar105 * uStack_4d8._4_4_;
          auVar47._16_4_ = fVar106 * (float)uStack_4d0;
          auVar47._20_4_ = fVar107 * uStack_4d0._4_4_;
          auVar47._24_4_ = fVar108 * (float)uStack_4c8;
          auVar47._28_4_ = pfVar4[7];
          auVar17 = vfmadd231ps_fma(auVar46,auVar134,local_680);
          auVar18 = vfmadd231ps_fma(auVar203._0_32_,auVar134,local_5c0);
          auVar92 = vfmadd231ps_fma(auVar47,local_2e0,auVar134);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar120,local_620);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar120,local_720);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_2c0,auVar120);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar186,local_560);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar186,local_400);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar186,local_480);
          pfVar3 = (float *)(lVar85 + 0x2203ee4 + lVar87 * 4);
          fVar124 = *pfVar3;
          fVar101 = pfVar3[1];
          fVar103 = pfVar3[2];
          fVar105 = pfVar3[3];
          fVar106 = pfVar3[4];
          fVar107 = pfVar3[5];
          fVar108 = pfVar3[6];
          auVar48._4_4_ = fStack_59c * fVar101;
          auVar48._0_4_ = local_5a0 * fVar124;
          auVar48._8_4_ = fStack_598 * fVar103;
          auVar48._12_4_ = fStack_594 * fVar105;
          auVar48._16_4_ = fStack_590 * fVar106;
          auVar48._20_4_ = fStack_58c * fVar107;
          auVar48._24_4_ = fStack_588 * fVar108;
          auVar48._28_4_ = fStack_584;
          auVar49._4_4_ = local_580._4_4_ * fVar101;
          auVar49._0_4_ = (float)local_580 * fVar124;
          auVar49._8_4_ = (float)uStack_578 * fVar103;
          auVar49._12_4_ = uStack_578._4_4_ * fVar105;
          auVar49._16_4_ = (float)uStack_570 * fVar106;
          auVar49._20_4_ = uStack_570._4_4_ * fVar107;
          auVar49._24_4_ = (float)uStack_568 * fVar108;
          auVar49._28_4_ = uStack_568._4_4_;
          auVar50._4_4_ = fVar101 * local_4e0._4_4_;
          auVar50._0_4_ = fVar124 * (float)local_4e0;
          auVar50._8_4_ = fVar103 * (float)uStack_4d8;
          auVar50._12_4_ = fVar105 * uStack_4d8._4_4_;
          auVar50._16_4_ = fVar106 * (float)uStack_4d0;
          auVar50._20_4_ = fVar107 * uStack_4d0._4_4_;
          auVar50._24_4_ = fVar108 * (float)uStack_4c8;
          auVar50._28_4_ = pfVar3[7];
          auVar186 = *(undefined1 (*) [32])(lVar85 + 0x2203a60 + lVar87 * 4);
          auVar91 = vfmadd231ps_fma(auVar48,auVar186,local_680);
          auVar126 = vfmadd231ps_fma(auVar49,auVar186,local_5c0);
          auVar110 = vfmadd231ps_fma(auVar50,local_2e0,auVar186);
          auVar186 = *(undefined1 (*) [32])(lVar85 + 0x22035dc + lVar87 * 4);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar186,local_620);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar186,local_720);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_2c0,auVar186);
          auVar186 = *(undefined1 (*) [32])(lVar85 + 0x2203158 + lVar87 * 4);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar186,local_560);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar186,local_400);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_480,auVar186);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar177._16_4_ = 0x7fffffff;
          auVar177._20_4_ = 0x7fffffff;
          auVar177._24_4_ = 0x7fffffff;
          auVar177._28_4_ = 0x7fffffff;
          auVar186 = vandps_avx(ZEXT1632(auVar17),auVar177);
          auVar120 = vandps_avx(ZEXT1632(auVar18),auVar177);
          auVar120 = vmaxps_avx(auVar186,auVar120);
          auVar186 = vandps_avx(ZEXT1632(auVar92),auVar177);
          auVar186 = vmaxps_avx(auVar120,auVar186);
          auVar74._4_4_ = uStack_fc;
          auVar74._0_4_ = local_100;
          auVar74._8_4_ = uStack_f8;
          auVar74._12_4_ = uStack_f4;
          auVar74._16_4_ = uStack_f0;
          auVar74._20_4_ = uStack_ec;
          auVar74._24_4_ = uStack_e8;
          auVar74._28_4_ = uStack_e4;
          auVar186 = vcmpps_avx(auVar186,auVar74,1);
          auVar134 = vblendvps_avx(ZEXT1632(auVar17),local_440,auVar186);
          auVar112 = vblendvps_avx(ZEXT1632(auVar18),_local_360,auVar186);
          auVar186 = vandps_avx(ZEXT1632(auVar91),auVar177);
          auVar120 = vandps_avx(ZEXT1632(auVar126),auVar177);
          auVar120 = vmaxps_avx(auVar186,auVar120);
          auVar186 = vandps_avx(auVar177,ZEXT1632(auVar110));
          auVar186 = vmaxps_avx(auVar120,auVar186);
          auVar120 = vcmpps_avx(auVar186,auVar74,1);
          auVar186 = vblendvps_avx(ZEXT1632(auVar91),local_440,auVar120);
          auVar120 = vblendvps_avx(ZEXT1632(auVar126),_local_360,auVar120);
          auVar16 = vfmadd213ps_fma(auVar121,local_480,ZEXT1632(auVar16));
          auVar17 = vfmadd213ps_fma(auVar134,auVar134,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,auVar112);
          auVar121 = vrsqrtps_avx(ZEXT1632(auVar17));
          fVar124 = auVar121._0_4_;
          fVar101 = auVar121._4_4_;
          fVar103 = auVar121._8_4_;
          fVar105 = auVar121._12_4_;
          fVar106 = auVar121._16_4_;
          fVar107 = auVar121._20_4_;
          fVar108 = auVar121._24_4_;
          auVar51._4_4_ = fVar101 * fVar101 * fVar101 * auVar17._4_4_ * -0.5;
          auVar51._0_4_ = fVar124 * fVar124 * fVar124 * auVar17._0_4_ * -0.5;
          auVar51._8_4_ = fVar103 * fVar103 * fVar103 * auVar17._8_4_ * -0.5;
          auVar51._12_4_ = fVar105 * fVar105 * fVar105 * auVar17._12_4_ * -0.5;
          auVar51._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
          auVar51._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
          auVar51._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar51._28_4_ = 0;
          auVar202._8_4_ = 0x3fc00000;
          auVar202._0_8_ = 0x3fc000003fc00000;
          auVar202._12_4_ = 0x3fc00000;
          auVar202._16_4_ = 0x3fc00000;
          auVar202._20_4_ = 0x3fc00000;
          auVar202._24_4_ = 0x3fc00000;
          auVar202._28_4_ = 0x3fc00000;
          auVar17 = vfmadd231ps_fma(auVar51,auVar202,auVar121);
          fVar124 = auVar17._0_4_;
          fVar101 = auVar17._4_4_;
          auVar52._4_4_ = auVar112._4_4_ * fVar101;
          auVar52._0_4_ = auVar112._0_4_ * fVar124;
          fVar103 = auVar17._8_4_;
          auVar52._8_4_ = auVar112._8_4_ * fVar103;
          fVar105 = auVar17._12_4_;
          auVar52._12_4_ = auVar112._12_4_ * fVar105;
          auVar52._16_4_ = auVar112._16_4_ * 0.0;
          auVar52._20_4_ = auVar112._20_4_ * 0.0;
          auVar52._24_4_ = auVar112._24_4_ * 0.0;
          auVar52._28_4_ = auVar121._28_4_;
          auVar53._4_4_ = fVar101 * -auVar134._4_4_;
          auVar53._0_4_ = fVar124 * -auVar134._0_4_;
          auVar53._8_4_ = fVar103 * -auVar134._8_4_;
          auVar53._12_4_ = fVar105 * -auVar134._12_4_;
          auVar53._16_4_ = -auVar134._16_4_ * 0.0;
          auVar53._20_4_ = -auVar134._20_4_ * 0.0;
          auVar53._24_4_ = -auVar134._24_4_ * 0.0;
          auVar53._28_4_ = auVar112._28_4_;
          auVar17 = vfmadd213ps_fma(auVar186,auVar186,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar120,auVar120);
          auVar121 = vrsqrtps_avx(ZEXT1632(auVar17));
          auVar54._28_4_ = local_400._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar105 * 0.0,
                                  CONCAT48(fVar103 * 0.0,CONCAT44(fVar101 * 0.0,fVar124 * 0.0))));
          fVar124 = auVar121._0_4_;
          fVar101 = auVar121._4_4_;
          fVar103 = auVar121._8_4_;
          fVar105 = auVar121._12_4_;
          fVar106 = auVar121._16_4_;
          fVar107 = auVar121._20_4_;
          fVar108 = auVar121._24_4_;
          auVar55._4_4_ = fVar101 * fVar101 * fVar101 * auVar17._4_4_ * -0.5;
          auVar55._0_4_ = fVar124 * fVar124 * fVar124 * auVar17._0_4_ * -0.5;
          auVar55._8_4_ = fVar103 * fVar103 * fVar103 * auVar17._8_4_ * -0.5;
          auVar55._12_4_ = fVar105 * fVar105 * fVar105 * auVar17._12_4_ * -0.5;
          auVar55._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
          auVar55._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
          auVar55._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar55._28_4_ = 0;
          auVar17 = vfmadd231ps_fma(auVar55,auVar202,auVar121);
          fVar124 = auVar17._0_4_;
          fVar101 = auVar17._4_4_;
          auVar56._4_4_ = auVar120._4_4_ * fVar101;
          auVar56._0_4_ = auVar120._0_4_ * fVar124;
          fVar103 = auVar17._8_4_;
          auVar56._8_4_ = auVar120._8_4_ * fVar103;
          fVar105 = auVar17._12_4_;
          auVar56._12_4_ = auVar120._12_4_ * fVar105;
          auVar56._16_4_ = auVar120._16_4_ * 0.0;
          auVar56._20_4_ = auVar120._20_4_ * 0.0;
          auVar56._24_4_ = auVar120._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = fVar101 * -auVar186._4_4_;
          auVar57._0_4_ = fVar124 * -auVar186._0_4_;
          auVar57._8_4_ = fVar103 * -auVar186._8_4_;
          auVar57._12_4_ = fVar105 * -auVar186._12_4_;
          auVar57._16_4_ = -auVar186._16_4_ * 0.0;
          auVar57._20_4_ = -auVar186._20_4_ * 0.0;
          auVar57._24_4_ = -auVar186._24_4_ * 0.0;
          auVar57._28_4_ = auVar121._28_4_;
          auVar58._28_4_ = 0xbf000000;
          auVar58._0_28_ =
               ZEXT1628(CONCAT412(fVar105 * 0.0,
                                  CONCAT48(fVar103 * 0.0,CONCAT44(fVar101 * 0.0,fVar124 * 0.0))));
          auVar17 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar146),local_340);
          auVar121 = ZEXT1632(auVar146);
          auVar18 = vfmadd213ps_fma(auVar53,auVar121,local_420);
          auVar92 = vfmadd213ps_fma(auVar54,auVar121,ZEXT1632(auVar16));
          auVar110 = vfnmadd213ps_fma(auVar52,auVar121,local_340);
          auVar91 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar14),local_320);
          auVar90 = vfnmadd213ps_fma(auVar53,auVar121,local_420);
          auVar121 = ZEXT1632(auVar14);
          auVar126 = vfmadd213ps_fma(auVar57,auVar121,local_300);
          local_740 = ZEXT1632(auVar146);
          auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar16),local_740,auVar54);
          auVar16 = vfmadd213ps_fma(auVar58,auVar121,ZEXT1632(auVar15));
          auVar111 = vfnmadd213ps_fma(auVar56,auVar121,local_320);
          auVar138 = vfnmadd213ps_fma(auVar57,auVar121,local_300);
          auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar14),auVar58);
          auVar121 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar90));
          auVar186 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar146));
          auVar59._4_4_ = auVar121._4_4_ * auVar146._4_4_;
          auVar59._0_4_ = auVar121._0_4_ * auVar146._0_4_;
          auVar59._8_4_ = auVar121._8_4_ * auVar146._8_4_;
          auVar59._12_4_ = auVar121._12_4_ * auVar146._12_4_;
          auVar59._16_4_ = auVar121._16_4_ * 0.0;
          auVar59._20_4_ = auVar121._20_4_ * 0.0;
          auVar59._24_4_ = auVar121._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar90),auVar186);
          auVar60._4_4_ = auVar110._4_4_ * auVar186._4_4_;
          auVar60._0_4_ = auVar110._0_4_ * auVar186._0_4_;
          auVar60._8_4_ = auVar110._8_4_ * auVar186._8_4_;
          auVar60._12_4_ = auVar110._12_4_ * auVar186._12_4_;
          auVar60._16_4_ = auVar186._16_4_ * 0.0;
          auVar60._20_4_ = auVar186._20_4_ * 0.0;
          auVar60._24_4_ = auVar186._24_4_ * 0.0;
          auVar60._28_4_ = auVar186._28_4_;
          auVar112 = ZEXT1632(auVar110);
          auVar186 = vsubps_avx(ZEXT1632(auVar91),auVar112);
          auVar99 = ZEXT1632(auVar146);
          auVar146 = vfmsub231ps_fma(auVar60,auVar99,auVar186);
          auVar61._4_4_ = auVar90._4_4_ * auVar186._4_4_;
          auVar61._0_4_ = auVar90._0_4_ * auVar186._0_4_;
          auVar61._8_4_ = auVar90._8_4_ * auVar186._8_4_;
          auVar61._12_4_ = auVar90._12_4_ * auVar186._12_4_;
          auVar61._16_4_ = auVar186._16_4_ * 0.0;
          auVar61._20_4_ = auVar186._20_4_ * 0.0;
          auVar61._24_4_ = auVar186._24_4_ * 0.0;
          auVar61._28_4_ = auVar186._28_4_;
          auVar110 = vfmsub231ps_fma(auVar61,auVar112,auVar121);
          auVar146 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar146));
          auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar9 = vcmpps_avx(ZEXT1632(auVar146),ZEXT832(0) << 0x20,2);
          local_780 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar17),auVar9);
          local_660 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar18),auVar9);
          auVar121 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar92),auVar9);
          auVar186 = vblendvps_avx(auVar112,ZEXT1632(auVar91),auVar9);
          auVar120 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar126),auVar9);
          auVar134 = vblendvps_avx(auVar99,ZEXT1632(auVar16),auVar9);
          auVar112 = vblendvps_avx(ZEXT1632(auVar91),auVar112,auVar9);
          auVar8 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar90),auVar9);
          auVar146 = vpackssdw_avx(local_3e0._0_16_,local_3e0._16_16_);
          local_7a0 = ZEXT1632(auVar146);
          auVar99 = vblendvps_avx(ZEXT1632(auVar16),auVar99,auVar9);
          auVar112 = vsubps_avx(auVar112,local_780);
          auVar8 = vsubps_avx(auVar8,local_660);
          auVar19 = vsubps_avx(auVar99,auVar121);
          auVar94 = vsubps_avx(local_780,auVar186);
          auVar21 = vsubps_avx(local_660,auVar120);
          auVar22 = vsubps_avx(auVar121,auVar134);
          auVar156._0_4_ = auVar19._0_4_ * local_780._0_4_;
          auVar156._4_4_ = auVar19._4_4_ * local_780._4_4_;
          auVar156._8_4_ = auVar19._8_4_ * local_780._8_4_;
          auVar156._12_4_ = auVar19._12_4_ * local_780._12_4_;
          auVar156._16_4_ = auVar19._16_4_ * local_780._16_4_;
          auVar156._20_4_ = auVar19._20_4_ * local_780._20_4_;
          auVar156._24_4_ = auVar19._24_4_ * local_780._24_4_;
          auVar156._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar156,auVar121,auVar112);
          auVar62._4_4_ = auVar112._4_4_ * local_660._4_4_;
          auVar62._0_4_ = auVar112._0_4_ * local_660._0_4_;
          auVar62._8_4_ = auVar112._8_4_ * local_660._8_4_;
          auVar62._12_4_ = auVar112._12_4_ * local_660._12_4_;
          auVar62._16_4_ = auVar112._16_4_ * local_660._16_4_;
          auVar62._20_4_ = auVar112._20_4_ * local_660._20_4_;
          auVar62._24_4_ = auVar112._24_4_ * local_660._24_4_;
          auVar62._28_4_ = auVar99._28_4_;
          auVar16 = vfmsub231ps_fma(auVar62,local_780,auVar8);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar157._0_4_ = auVar8._0_4_ * auVar121._0_4_;
          auVar157._4_4_ = auVar8._4_4_ * auVar121._4_4_;
          auVar157._8_4_ = auVar8._8_4_ * auVar121._8_4_;
          auVar157._12_4_ = auVar8._12_4_ * auVar121._12_4_;
          auVar157._16_4_ = auVar8._16_4_ * auVar121._16_4_;
          auVar157._20_4_ = auVar8._20_4_ * auVar121._20_4_;
          auVar157._24_4_ = auVar8._24_4_ * auVar121._24_4_;
          auVar157._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar157,local_660,auVar19);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar136 = ZEXT1664(auVar16);
          auVar158._0_4_ = auVar22._0_4_ * auVar186._0_4_;
          auVar158._4_4_ = auVar22._4_4_ * auVar186._4_4_;
          auVar158._8_4_ = auVar22._8_4_ * auVar186._8_4_;
          auVar158._12_4_ = auVar22._12_4_ * auVar186._12_4_;
          auVar158._16_4_ = auVar22._16_4_ * auVar186._16_4_;
          auVar158._20_4_ = auVar22._20_4_ * auVar186._20_4_;
          auVar158._24_4_ = auVar22._24_4_ * auVar186._24_4_;
          auVar158._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar158,auVar94,auVar134);
          auVar63._4_4_ = auVar21._4_4_ * auVar134._4_4_;
          auVar63._0_4_ = auVar21._0_4_ * auVar134._0_4_;
          auVar63._8_4_ = auVar21._8_4_ * auVar134._8_4_;
          auVar63._12_4_ = auVar21._12_4_ * auVar134._12_4_;
          auVar63._16_4_ = auVar21._16_4_ * auVar134._16_4_;
          auVar63._20_4_ = auVar21._20_4_ * auVar134._20_4_;
          auVar63._24_4_ = auVar21._24_4_ * auVar134._24_4_;
          auVar63._28_4_ = auVar134._28_4_;
          auVar17 = vfmsub231ps_fma(auVar63,auVar120,auVar22);
          auVar64._4_4_ = auVar94._4_4_ * auVar120._4_4_;
          auVar64._0_4_ = auVar94._0_4_ * auVar120._0_4_;
          auVar64._8_4_ = auVar94._8_4_ * auVar120._8_4_;
          auVar64._12_4_ = auVar94._12_4_ * auVar120._12_4_;
          auVar64._16_4_ = auVar94._16_4_ * auVar120._16_4_;
          auVar64._20_4_ = auVar94._20_4_ * auVar120._20_4_;
          auVar64._24_4_ = auVar94._24_4_ * auVar120._24_4_;
          auVar64._28_4_ = auVar120._28_4_;
          auVar18 = vfmsub231ps_fma(auVar64,auVar21,auVar186);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar186 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
          auVar186 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
          auVar15 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
          auVar146 = vpand_avx(auVar15,auVar146);
          auVar186 = vpmovsxwd_avx2(auVar146);
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar186 >> 0x7f,0) == '\0') &&
                (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar186 >> 0xbf,0) == '\0') &&
              (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar186[0x1f]) {
LAB_01123ed5:
            auVar141 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
            auVar196 = ZEXT3264(auVar196._0_32_);
            auVar178 = ZEXT3264(auVar174);
          }
          else {
            auVar65._4_4_ = auVar8._4_4_ * auVar22._4_4_;
            auVar65._0_4_ = auVar8._0_4_ * auVar22._0_4_;
            auVar65._8_4_ = auVar8._8_4_ * auVar22._8_4_;
            auVar65._12_4_ = auVar8._12_4_ * auVar22._12_4_;
            auVar65._16_4_ = auVar8._16_4_ * auVar22._16_4_;
            auVar65._20_4_ = auVar8._20_4_ * auVar22._20_4_;
            auVar65._24_4_ = auVar8._24_4_ * auVar22._24_4_;
            auVar65._28_4_ = auVar186._28_4_;
            auVar91 = vfmsub231ps_fma(auVar65,auVar21,auVar19);
            auVar163._0_4_ = auVar94._0_4_ * auVar19._0_4_;
            auVar163._4_4_ = auVar94._4_4_ * auVar19._4_4_;
            auVar163._8_4_ = auVar94._8_4_ * auVar19._8_4_;
            auVar163._12_4_ = auVar94._12_4_ * auVar19._12_4_;
            auVar163._16_4_ = auVar94._16_4_ * auVar19._16_4_;
            auVar163._20_4_ = auVar94._20_4_ * auVar19._20_4_;
            auVar163._24_4_ = auVar94._24_4_ * auVar19._24_4_;
            auVar163._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar163,auVar112,auVar22);
            auVar66._4_4_ = auVar112._4_4_ * auVar21._4_4_;
            auVar66._0_4_ = auVar112._0_4_ * auVar21._0_4_;
            auVar66._8_4_ = auVar112._8_4_ * auVar21._8_4_;
            auVar66._12_4_ = auVar112._12_4_ * auVar21._12_4_;
            auVar66._16_4_ = auVar112._16_4_ * auVar21._16_4_;
            auVar66._20_4_ = auVar112._20_4_ * auVar21._20_4_;
            auVar66._24_4_ = auVar112._24_4_ * auVar21._24_4_;
            auVar66._28_4_ = auVar21._28_4_;
            auVar126 = vfmsub231ps_fma(auVar66,auVar94,auVar8);
            auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar126));
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar91),ZEXT832(0) << 0x20);
            auVar186 = vrcpps_avx(ZEXT1632(auVar18));
            auVar195._8_4_ = 0x3f800000;
            auVar195._0_8_ = 0x3f8000003f800000;
            auVar195._12_4_ = 0x3f800000;
            auVar195._16_4_ = 0x3f800000;
            auVar195._20_4_ = 0x3f800000;
            auVar195._24_4_ = 0x3f800000;
            auVar195._28_4_ = 0x3f800000;
            auVar15 = vfnmadd213ps_fma(auVar186,ZEXT1632(auVar18),auVar195);
            auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar186,auVar186);
            auVar67._4_4_ = auVar126._4_4_ * auVar121._4_4_;
            auVar67._0_4_ = auVar126._0_4_ * auVar121._0_4_;
            auVar67._8_4_ = auVar126._8_4_ * auVar121._8_4_;
            auVar67._12_4_ = auVar126._12_4_ * auVar121._12_4_;
            auVar67._16_4_ = auVar121._16_4_ * 0.0;
            auVar67._20_4_ = auVar121._20_4_ * 0.0;
            auVar67._24_4_ = auVar121._24_4_ * 0.0;
            auVar67._28_4_ = auVar121._28_4_;
            auVar92 = vfmadd231ps_fma(auVar67,ZEXT1632(auVar92),local_660);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar91),local_780);
            fVar101 = auVar15._0_4_;
            fVar103 = auVar15._4_4_;
            fVar105 = auVar15._8_4_;
            fVar106 = auVar15._12_4_;
            auVar120 = ZEXT1632(CONCAT412(fVar106 * auVar92._12_4_,
                                          CONCAT48(fVar105 * auVar92._8_4_,
                                                   CONCAT44(fVar103 * auVar92._4_4_,
                                                            fVar101 * auVar92._0_4_))));
            fVar124 = ray->tfar;
            auVar140._4_4_ = fVar124;
            auVar140._0_4_ = fVar124;
            auVar140._8_4_ = fVar124;
            auVar140._12_4_ = fVar124;
            auVar140._16_4_ = fVar124;
            auVar140._20_4_ = fVar124;
            auVar140._24_4_ = fVar124;
            auVar140._28_4_ = fVar124;
            auVar73._8_8_ = uStack_118;
            auVar73._0_8_ = local_120;
            auVar73._16_8_ = uStack_110;
            auVar73._24_8_ = uStack_108;
            auVar121 = vcmpps_avx(auVar73,auVar120,2);
            auVar186 = vcmpps_avx(auVar120,auVar140,2);
            auVar121 = vandps_avx(auVar186,auVar121);
            auVar15 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
            auVar146 = vpand_avx(auVar146,auVar15);
            auVar121 = vpmovsxwd_avx2(auVar146);
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar121 >> 0x7f,0) == '\0') &&
                  (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0xbf,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar121[0x1f]) goto LAB_01123ed5;
            auVar121 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
            auVar15 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
            auVar146 = vpand_avx(auVar146,auVar15);
            auVar121 = vpmovsxwd_avx2(auVar146);
            auVar141 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
            auVar196 = ZEXT3264(auVar196._0_32_);
            auVar178 = ZEXT3264(auVar174);
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar134 = ZEXT1632(CONCAT412(fVar106 * auVar16._12_4_,
                                            CONCAT48(fVar105 * auVar16._8_4_,
                                                     CONCAT44(fVar103 * auVar16._4_4_,
                                                              fVar101 * auVar16._0_4_))));
              auVar68._28_4_ = SUB84(uStack_488,4);
              auVar68._0_28_ =
                   ZEXT1628(CONCAT412(fVar106 * auVar17._12_4_,
                                      CONCAT48(fVar105 * auVar17._8_4_,
                                               CONCAT44(fVar103 * auVar17._4_4_,
                                                        fVar101 * auVar17._0_4_))));
              auVar168._8_4_ = 0x3f800000;
              auVar168._0_8_ = 0x3f8000003f800000;
              auVar168._12_4_ = 0x3f800000;
              auVar168._16_4_ = 0x3f800000;
              auVar168._20_4_ = 0x3f800000;
              auVar168._24_4_ = 0x3f800000;
              auVar168._28_4_ = 0x3f800000;
              auVar186 = vsubps_avx(auVar168,auVar134);
              auVar186 = vblendvps_avx(auVar186,auVar134,auVar9);
              auVar196 = ZEXT3264(auVar186);
              auVar186 = vsubps_avx(auVar168,auVar68);
              local_3c0 = vblendvps_avx(auVar186,auVar68,auVar9);
              auVar136 = ZEXT3264(local_3c0);
              auVar141 = ZEXT3264(auVar121);
              auVar178 = ZEXT3264(auVar120);
            }
          }
          auVar204 = ZEXT3264(local_5c0);
          auVar203 = ZEXT3264(local_680);
          auVar198 = ZEXT3264(local_6e0);
          auVar187 = ZEXT3264(local_6c0);
          pRVar79 = (RTCIntersectArguments *)((ulong)pRVar79 & 0xffffffff);
          auVar121 = auVar141._0_32_;
          auVar100 = ZEXT3264(local_740);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar141 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar141 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar141[0x1f]) {
            auVar123 = ZEXT3264(local_720);
            auVar167 = ZEXT3264(CONCAT428(fStack_584,
                                          CONCAT424(fStack_588,
                                                    CONCAT420(fStack_58c,
                                                              CONCAT416(fStack_590,
                                                                        CONCAT412(fStack_594,
                                                                                  CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
            auVar169 = ZEXT3264(local_620);
            goto LAB_01123eba;
          }
          auVar186 = vsubps_avx(ZEXT1632(auVar14),local_740);
          local_280 = auVar196._0_32_;
          auVar146 = vfmadd213ps_fma(auVar186,local_280,local_740);
          fVar124 = local_7b8->depth_scale;
          auVar69._4_4_ = (auVar146._4_4_ + auVar146._4_4_) * fVar124;
          auVar69._0_4_ = (auVar146._0_4_ + auVar146._0_4_) * fVar124;
          auVar69._8_4_ = (auVar146._8_4_ + auVar146._8_4_) * fVar124;
          auVar69._12_4_ = (auVar146._12_4_ + auVar146._12_4_) * fVar124;
          auVar69._16_4_ = fVar124 * 0.0;
          auVar69._20_4_ = fVar124 * 0.0;
          auVar69._24_4_ = fVar124 * 0.0;
          auVar69._28_4_ = fVar124;
          local_240 = auVar178._0_32_;
          auVar186 = vcmpps_avx(local_240,auVar69,6);
          auVar100 = ZEXT3264(auVar186);
          auVar120 = auVar121 & auVar186;
          auVar167 = ZEXT3264(CONCAT428(fStack_584,
                                        CONCAT424(fStack_588,
                                                  CONCAT420(fStack_58c,
                                                            CONCAT416(fStack_590,
                                                                      CONCAT412(fStack_594,
                                                                                CONCAT48(fStack_598,
                                                                                         CONCAT44(
                                                  fStack_59c,local_5a0))))))));
          auVar169 = ZEXT3264(local_620);
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar120 >> 0x7f,0) == '\0') &&
                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar120 >> 0xbf,0) == '\0') &&
              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar120[0x1f]) {
            auVar123 = ZEXT3264(local_720);
            goto LAB_01123eba;
          }
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar135._8_4_ = 0x40000000;
          auVar135._0_8_ = 0x4000000040000000;
          auVar135._12_4_ = 0x40000000;
          auVar135._16_4_ = 0x40000000;
          auVar135._20_4_ = 0x40000000;
          auVar135._24_4_ = 0x40000000;
          auVar135._28_4_ = 0x40000000;
          auVar136 = ZEXT3264(auVar135);
          auVar146 = vfmadd213ps_fma(local_3c0,auVar135,auVar122);
          local_260 = ZEXT1632(auVar146);
          local_21c = iVar11;
          local_210 = local_600;
          uStack_208 = uStack_5f8;
          local_200 = local_520._0_8_;
          uStack_1f8 = local_520._8_8_;
          local_1f0 = local_530._0_8_;
          uStack_1e8 = local_530._8_8_;
          pGVar12 = (context->scene->geometries).items[local_6e8].ptr;
          local_3c0 = ZEXT1632(auVar146);
          auVar120 = local_3c0;
          if ((pGVar12->mask & ray->mask) == 0) {
            pRVar79 = (RTCIntersectArguments *)0x0;
            auVar123 = ZEXT3264(local_720);
          }
          else {
            pRVar79 = context->args;
            auVar123 = ZEXT3264(local_720);
            if ((pRVar79->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar79 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar79 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_660._0_8_ = pGVar12;
              auVar121 = vandps_avx(auVar186,auVar121);
              auVar100 = ZEXT3264(auVar121);
              local_640 = local_280;
              fVar125 = (float)local_220;
              auVar136 = ZEXT3264(CONCAT428(fVar125,CONCAT424(fVar125,CONCAT420(fVar125,CONCAT416(
                                                  fVar125,CONCAT412(fVar125,CONCAT48(fVar125,
                                                  CONCAT44(fVar125,fVar125))))))));
              local_1a0[0] = (fVar125 + auVar196._0_4_ + 0.0) * (float)local_140._0_4_;
              local_1a0[1] = (fVar125 + auVar196._4_4_ + 1.0) * (float)local_140._4_4_;
              local_1a0[2] = (fVar125 + auVar196._8_4_ + 2.0) * fStack_138;
              local_1a0[3] = (fVar125 + auVar196._12_4_ + 3.0) * fStack_134;
              fStack_190 = (fVar125 + auVar196._16_4_ + 4.0) * fStack_130;
              fStack_18c = (fVar125 + auVar196._20_4_ + 5.0) * fStack_12c;
              fStack_188 = (fVar125 + auVar196._24_4_ + 6.0) * fStack_128;
              fStack_184 = fVar125 + auVar196._28_4_ + 7.0;
              local_3c0._0_8_ = auVar146._0_8_;
              local_3c0._8_8_ = auVar146._8_8_;
              local_180 = local_3c0._0_8_;
              uStack_178 = local_3c0._8_8_;
              uStack_170 = 0;
              uStack_168 = 0;
              local_6a0 = local_240;
              local_160 = local_240;
              uVar77 = vmovmskps_avx(auVar121);
              uVar81 = CONCAT44((int)((ulong)pRVar79 >> 0x20),uVar77);
              _local_460 = auVar13;
              local_3c0 = auVar120;
              do {
                lVar23 = 0;
                for (uVar80 = uVar81; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000)
                {
                  lVar23 = lVar23 + 1;
                }
                local_740._0_8_ = lVar23;
                local_7a0._0_8_ = uVar81;
                if (uVar81 == 0) {
                  pRVar79 = (RTCIntersectArguments *)0x0;
                  goto LAB_01123f26;
                }
                local_504 = local_1a0[lVar23];
                auVar100 = ZEXT464((uint)local_504);
                local_500 = *(undefined4 *)((long)&local_180 + lVar23 * 4);
                local_780._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_160 + lVar23 * 4);
                local_5f0.context = context->user;
                fVar125 = 1.0 - local_504;
                auVar146 = ZEXT416((uint)(local_504 * fVar125 * 4.0));
                auVar14 = vfnmsub213ss_fma(ZEXT416((uint)local_504),ZEXT416((uint)local_504),
                                           auVar146);
                auVar146 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),auVar146);
                fVar125 = fVar125 * -fVar125 * 0.5;
                fVar124 = auVar14._0_4_ * 0.5;
                fVar102 = auVar146._0_4_ * 0.5;
                fVar104 = local_504 * local_504 * 0.5;
                auVar147._0_4_ = fVar104 * (float)local_4c0._0_4_;
                auVar147._4_4_ = fVar104 * (float)local_4c0._4_4_;
                auVar147._8_4_ = fVar104 * fStack_4b8;
                auVar147._12_4_ = fVar104 * fStack_4b4;
                auVar129._4_4_ = fVar102;
                auVar129._0_4_ = fVar102;
                auVar129._8_4_ = fVar102;
                auVar129._12_4_ = fVar102;
                auVar146 = vfmadd132ps_fma(auVar129,auVar147,local_530);
                auVar148._4_4_ = fVar124;
                auVar148._0_4_ = fVar124;
                auVar148._8_4_ = fVar124;
                auVar148._12_4_ = fVar124;
                auVar146 = vfmadd132ps_fma(auVar148,auVar146,local_520);
                auVar130._4_4_ = fVar125;
                auVar130._0_4_ = fVar125;
                auVar130._8_4_ = fVar125;
                auVar130._12_4_ = fVar125;
                auVar72._8_8_ = uStack_5f8;
                auVar72._0_8_ = local_600;
                auVar146 = vfmadd132ps_fma(auVar130,auVar146,auVar72);
                auVar136 = ZEXT1664(auVar146);
                local_510 = vmovlps_avx(auVar146);
                local_508 = vextractps_avx(auVar146,2);
                local_4fc = local_7a4;
                local_4f8 = (int)local_6e8;
                local_4f4 = (local_5f0.context)->instID[0];
                local_4f0 = (local_5f0.context)->instPrimID[0];
                local_7c4 = -1;
                local_5f0.valid = &local_7c4;
                local_5f0.geometryUserPtr = *(void **)(local_660._0_8_ + 0x18);
                local_5f0.ray = (RTCRayN *)ray;
                local_5f0.hit = (RTCHitN *)&local_510;
                local_5f0.N = 1;
                if (*(code **)(local_660._0_8_ + 0x48) == (code *)0x0) {
LAB_01123e33:
                  p_Var82 = context->args->filter;
                  if ((p_Var82 == (RTCFilterFunctionN)0x0) ||
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(local_660._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_01123f20;
                  auVar136 = ZEXT1664(auVar136._0_16_);
                  auVar100._0_8_ = (*p_Var82)(&local_5f0);
                  auVar100._8_56_ = extraout_var_00;
                  if (*local_5f0.valid != 0) goto LAB_01123f20;
                }
                else {
                  auVar136 = ZEXT1664(auVar146);
                  auVar100._0_8_ = (**(code **)(local_660._0_8_ + 0x48))(&local_5f0);
                  auVar100._8_56_ = extraout_var;
                  if (*local_5f0.valid != 0) goto LAB_01123e33;
                }
                auVar100 = ZEXT464((uint)local_780._0_4_);
                ray->tfar = (float)local_780._0_4_;
                uVar81 = local_7a0._0_8_ ^ 1L << (local_740._0_8_ & 0x3f);
              } while( true );
            }
          }
          goto LAB_01123eaf;
        }
        auVar178 = ZEXT3264(auVar174);
        auVar187 = ZEXT3264(local_6c0);
        auVar198 = ZEXT3264(local_6e0);
        auVar123 = ZEXT3264(local_720);
        auVar203 = ZEXT3264(local_680);
        auVar204 = ZEXT3264(local_5c0);
        auVar167 = ZEXT3264(CONCAT428(fStack_584,
                                      CONCAT424(fStack_588,
                                                CONCAT420(fStack_58c,
                                                          CONCAT416(fStack_590,
                                                                    CONCAT412(fStack_594,
                                                                              CONCAT48(fStack_598,
                                                                                       CONCAT44(
                                                  fStack_59c,local_5a0))))))));
        auVar169 = ZEXT3264(local_620);
        pRVar79 = (RTCIntersectArguments *)((ulong)pRVar79 & 0xffffffff);
        goto LAB_01123eba;
      }
    }
    if (((ulong)pRVar79 & 1) != 0) break;
    fVar125 = ray->tfar;
    auVar93._4_4_ = fVar125;
    auVar93._0_4_ = fVar125;
    auVar93._8_4_ = fVar125;
    auVar93._12_4_ = fVar125;
    auVar146 = vcmpps_avx(local_2a0,auVar93,2);
    uVar83 = vmovmskps_avx(auVar146);
  }
  return local_4a8 != 0;
LAB_01123f20:
  pRVar79 = (RTCIntersectArguments *)0x1;
LAB_01123f26:
  auVar196 = ZEXT3264(local_640);
  auVar178 = ZEXT3264(local_6a0);
  auVar187 = ZEXT3264(local_6c0);
  auVar198 = ZEXT3264(local_6e0);
  auVar123 = ZEXT3264(local_720);
  auVar203 = ZEXT3264(local_680);
  auVar204 = ZEXT3264(local_5c0);
  auVar167 = ZEXT3264(CONCAT428(fStack_584,
                                CONCAT424(fStack_588,
                                          CONCAT420(fStack_58c,
                                                    CONCAT416(fStack_590,
                                                              CONCAT412(fStack_594,
                                                                        CONCAT48(fStack_598,
                                                                                 CONCAT44(fStack_59c
                                                                                          ,local_5a0
                                                                                         ))))))));
  auVar169 = ZEXT3264(local_620);
  fVar125 = (float)local_580;
  fVar102 = local_580._4_4_;
  fVar104 = (float)uStack_578;
  fVar205 = uStack_578._4_4_;
  fVar206 = (float)uStack_570;
  fVar207 = uStack_570._4_4_;
  fVar208 = (float)uStack_568;
LAB_01123eaf:
  pRVar79 = (RTCIntersectArguments *)(ulong)CONCAT31(local_760._1_3_,local_760[0] | (byte)pRVar79);
LAB_01123eba:
  lVar87 = lVar87 + 8;
  auVar141 = ZEXT3264(local_560);
  goto LAB_011232a7;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }